

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx512::CurveNvIntersectorK<8,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  float fVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  long lVar57;
  undefined1 auVar58 [12];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  byte bVar66;
  byte bVar67;
  byte bVar68;
  ulong uVar69;
  byte bVar70;
  ulong uVar71;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  byte bVar72;
  byte bVar73;
  byte bVar74;
  uint uVar75;
  ulong uVar76;
  int iVar77;
  long lVar78;
  bool bVar79;
  bool bVar80;
  ulong uVar81;
  uint uVar82;
  uint uVar143;
  uint uVar144;
  uint uVar146;
  uint uVar147;
  uint uVar148;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  uint uVar145;
  uint uVar149;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar138 [64];
  undefined1 auVar140 [64];
  undefined1 auVar142 [64];
  float pp;
  float fVar150;
  undefined4 uVar151;
  float fVar152;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar173;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar171;
  float fVar172;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar170 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar195;
  float fVar196;
  float fVar212;
  float fVar213;
  undefined1 auVar197 [16];
  float fVar214;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  float fVar215;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar235;
  float fVar236;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar238;
  undefined1 auVar237 [64];
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  float fVar244;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar245 [64];
  float fVar250;
  undefined1 auVar251 [64];
  float fVar254;
  undefined1 auVar252 [32];
  undefined1 auVar253 [64];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [64];
  undefined1 auVar258 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  undefined1 local_990 [16];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [64];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte local_1a0 [32];
  undefined1 auStack_180 [32];
  float local_160 [2];
  int local_158 [74];
  undefined1 auVar128 [32];
  undefined1 auVar139 [64];
  undefined1 auVar141 [64];
  undefined1 auVar259 [64];
  
  PVar2 = prim[1];
  uVar69 = (ulong)(byte)PVar2;
  lVar57 = uVar69 * 0x19;
  fVar244 = *(float *)(prim + lVar57 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar88 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar87 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + lVar57 + 6));
  fVar215 = fVar244 * auVar87._0_4_;
  fVar150 = fVar244 * auVar88._0_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar69 * 4 + 6);
  auVar97 = vpmovsxbd_avx2(auVar12);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar69 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar13);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar69 * 6 + 6);
  auVar98 = vpmovsxbd_avx2(auVar85);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar99 = vpmovsxbd_avx2(auVar197);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar100 = vpmovsxbd_avx2(auVar83);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar69 + 6);
  auVar101 = vpmovsxbd_avx2(auVar1);
  auVar101 = vcvtdq2ps_avx(auVar101);
  uVar76 = (ulong)(uint)((int)(uVar69 * 9) * 2);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar76 + 6);
  auVar102 = vpmovsxbd_avx2(auVar86);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar76 + uVar69 + 6);
  auVar105 = vpmovsxbd_avx2(auVar84);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar103 = vcvtdq2ps_avx(auVar105);
  uVar81 = (ulong)(uint)((int)(uVar69 * 5) << 2);
  auVar225._8_8_ = 0;
  auVar225._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar94 = vpmovsxbd_avx2(auVar225);
  auVar104 = vcvtdq2ps_avx(auVar94);
  auVar113._4_4_ = fVar150;
  auVar113._0_4_ = fVar150;
  auVar113._8_4_ = fVar150;
  auVar113._12_4_ = fVar150;
  auVar113._16_4_ = fVar150;
  auVar113._20_4_ = fVar150;
  auVar113._24_4_ = fVar150;
  auVar113._28_4_ = fVar150;
  auVar115._8_4_ = 1;
  auVar115._0_8_ = 0x100000001;
  auVar115._12_4_ = 1;
  auVar115._16_4_ = 1;
  auVar115._20_4_ = 1;
  auVar115._24_4_ = 1;
  auVar115._28_4_ = 1;
  auVar106 = ZEXT1632(CONCAT412(fVar244 * auVar88._12_4_,
                                CONCAT48(fVar244 * auVar88._8_4_,
                                         CONCAT44(fVar244 * auVar88._4_4_,fVar150))));
  auVar95 = vpermps_avx2(auVar115,auVar106);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar93 = vpermps_avx512vl(auVar92,auVar106);
  fVar150 = auVar93._0_4_;
  fVar246 = auVar93._4_4_;
  auVar106._4_4_ = fVar246 * auVar98._4_4_;
  auVar106._0_4_ = fVar150 * auVar98._0_4_;
  fVar247 = auVar93._8_4_;
  auVar106._8_4_ = fVar247 * auVar98._8_4_;
  fVar248 = auVar93._12_4_;
  auVar106._12_4_ = fVar248 * auVar98._12_4_;
  fVar239 = auVar93._16_4_;
  auVar106._16_4_ = fVar239 * auVar98._16_4_;
  fVar240 = auVar93._20_4_;
  auVar106._20_4_ = fVar240 * auVar98._20_4_;
  fVar249 = auVar93._24_4_;
  auVar106._24_4_ = fVar249 * auVar98._24_4_;
  auVar106._28_4_ = auVar105._28_4_;
  auVar105._4_4_ = auVar101._4_4_ * fVar246;
  auVar105._0_4_ = auVar101._0_4_ * fVar150;
  auVar105._8_4_ = auVar101._8_4_ * fVar247;
  auVar105._12_4_ = auVar101._12_4_ * fVar248;
  auVar105._16_4_ = auVar101._16_4_ * fVar239;
  auVar105._20_4_ = auVar101._20_4_ * fVar240;
  auVar105._24_4_ = auVar101._24_4_ * fVar249;
  auVar105._28_4_ = auVar94._28_4_;
  auVar94._4_4_ = auVar104._4_4_ * fVar246;
  auVar94._0_4_ = auVar104._0_4_ * fVar150;
  auVar94._8_4_ = auVar104._8_4_ * fVar247;
  auVar94._12_4_ = auVar104._12_4_ * fVar248;
  auVar94._16_4_ = auVar104._16_4_ * fVar239;
  auVar94._20_4_ = auVar104._20_4_ * fVar240;
  auVar94._24_4_ = auVar104._24_4_ * fVar249;
  auVar94._28_4_ = auVar93._28_4_;
  auVar12 = vfmadd231ps_fma(auVar106,auVar95,auVar96);
  auVar13 = vfmadd231ps_fma(auVar105,auVar95,auVar100);
  auVar85 = vfmadd231ps_fma(auVar94,auVar103,auVar95);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar113,auVar97);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar113,auVar99);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar102,auVar113);
  auVar114._4_4_ = fVar215;
  auVar114._0_4_ = fVar215;
  auVar114._8_4_ = fVar215;
  auVar114._12_4_ = fVar215;
  auVar114._16_4_ = fVar215;
  auVar114._20_4_ = fVar215;
  auVar114._24_4_ = fVar215;
  auVar114._28_4_ = fVar215;
  auVar94 = ZEXT1632(CONCAT412(fVar244 * auVar87._12_4_,
                               CONCAT48(fVar244 * auVar87._8_4_,
                                        CONCAT44(fVar244 * auVar87._4_4_,fVar215))));
  auVar105 = vpermps_avx2(auVar115,auVar94);
  auVar94 = vpermps_avx512vl(auVar92,auVar94);
  auVar95 = vmulps_avx512vl(auVar94,auVar98);
  auVar108._0_4_ = auVar94._0_4_ * auVar101._0_4_;
  auVar108._4_4_ = auVar94._4_4_ * auVar101._4_4_;
  auVar108._8_4_ = auVar94._8_4_ * auVar101._8_4_;
  auVar108._12_4_ = auVar94._12_4_ * auVar101._12_4_;
  auVar108._16_4_ = auVar94._16_4_ * auVar101._16_4_;
  auVar108._20_4_ = auVar94._20_4_ * auVar101._20_4_;
  auVar108._24_4_ = auVar94._24_4_ * auVar101._24_4_;
  auVar108._28_4_ = 0;
  auVar101._4_4_ = auVar94._4_4_ * auVar104._4_4_;
  auVar101._0_4_ = auVar94._0_4_ * auVar104._0_4_;
  auVar101._8_4_ = auVar94._8_4_ * auVar104._8_4_;
  auVar101._12_4_ = auVar94._12_4_ * auVar104._12_4_;
  auVar101._16_4_ = auVar94._16_4_ * auVar104._16_4_;
  auVar101._20_4_ = auVar94._20_4_ * auVar104._20_4_;
  auVar101._24_4_ = auVar94._24_4_ * auVar104._24_4_;
  auVar101._28_4_ = auVar98._28_4_;
  auVar96 = vfmadd231ps_avx512vl(auVar95,auVar105,auVar96);
  auVar197 = vfmadd231ps_fma(auVar108,auVar105,auVar100);
  auVar83 = vfmadd231ps_fma(auVar101,auVar105,auVar103);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar114,auVar97);
  auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar114,auVar99);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar114,auVar102);
  auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar261 = ZEXT3264(auVar97);
  vandps_avx512vl(ZEXT1632(auVar12),auVar97);
  auVar110._8_4_ = 0x219392ef;
  auVar110._0_8_ = 0x219392ef219392ef;
  auVar110._12_4_ = 0x219392ef;
  auVar110._16_4_ = 0x219392ef;
  auVar110._20_4_ = 0x219392ef;
  auVar110._24_4_ = 0x219392ef;
  auVar110._28_4_ = 0x219392ef;
  uVar76 = vcmpps_avx512vl(auVar97,auVar110,1);
  bVar80 = (bool)((byte)uVar76 & 1);
  auVar95._0_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar12._0_4_;
  bVar80 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar12._4_4_;
  bVar80 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar12._8_4_;
  bVar80 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar12._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar13),auVar97);
  uVar76 = vcmpps_avx512vl(auVar95,auVar110,1);
  bVar80 = (bool)((byte)uVar76 & 1);
  auVar92._0_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar13._0_4_;
  bVar80 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar13._4_4_;
  bVar80 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar13._8_4_;
  bVar80 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar13._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar85),auVar97);
  uVar76 = vcmpps_avx512vl(auVar92,auVar110,1);
  bVar80 = (bool)((byte)uVar76 & 1);
  auVar97._0_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar85._0_4_;
  bVar80 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar85._4_4_;
  bVar80 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar85._8_4_;
  bVar80 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar85._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar98 = vrcp14ps_avx512vl(auVar95);
  auVar111._8_4_ = 0x3f800000;
  auVar111._0_8_ = &DAT_3f8000003f800000;
  auVar111._12_4_ = 0x3f800000;
  auVar111._16_4_ = 0x3f800000;
  auVar111._20_4_ = 0x3f800000;
  auVar111._24_4_ = 0x3f800000;
  auVar111._28_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar95,auVar98,auVar111);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar92);
  auVar13 = vfnmadd213ps_fma(auVar92,auVar98,auVar111);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar97);
  auVar85 = vfnmadd213ps_fma(auVar97,auVar98,auVar111);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar98,auVar98);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 7 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vsubps_avx512vl(auVar97,auVar96);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 9 + 6));
  auVar102._4_4_ = auVar12._4_4_ * auVar98._4_4_;
  auVar102._0_4_ = auVar12._0_4_ * auVar98._0_4_;
  auVar102._8_4_ = auVar12._8_4_ * auVar98._8_4_;
  auVar102._12_4_ = auVar12._12_4_ * auVar98._12_4_;
  auVar102._16_4_ = auVar98._16_4_ * 0.0;
  auVar102._20_4_ = auVar98._20_4_ * 0.0;
  auVar102._24_4_ = auVar98._24_4_ * 0.0;
  auVar102._28_4_ = auVar98._28_4_;
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx512vl(auVar97,auVar96);
  auVar109._0_4_ = auVar12._0_4_ * auVar97._0_4_;
  auVar109._4_4_ = auVar12._4_4_ * auVar97._4_4_;
  auVar109._8_4_ = auVar12._8_4_ * auVar97._8_4_;
  auVar109._12_4_ = auVar12._12_4_ * auVar97._12_4_;
  auVar109._16_4_ = auVar97._16_4_ * 0.0;
  auVar109._20_4_ = auVar97._20_4_ * 0.0;
  auVar109._24_4_ = auVar97._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar69 * -2 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar197));
  auVar103._4_4_ = auVar13._4_4_ * auVar97._4_4_;
  auVar103._0_4_ = auVar13._0_4_ * auVar97._0_4_;
  auVar103._8_4_ = auVar13._8_4_ * auVar97._8_4_;
  auVar103._12_4_ = auVar13._12_4_ * auVar97._12_4_;
  auVar103._16_4_ = auVar97._16_4_ * 0.0;
  auVar103._20_4_ = auVar97._20_4_ * 0.0;
  auVar103._24_4_ = auVar97._24_4_ * 0.0;
  auVar103._28_4_ = auVar97._28_4_;
  auVar97 = vcvtdq2ps_avx(auVar96);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar197));
  auVar107._0_4_ = auVar13._0_4_ * auVar97._0_4_;
  auVar107._4_4_ = auVar13._4_4_ * auVar97._4_4_;
  auVar107._8_4_ = auVar13._8_4_ * auVar97._8_4_;
  auVar107._12_4_ = auVar13._12_4_ * auVar97._12_4_;
  auVar107._16_4_ = auVar97._16_4_ * 0.0;
  auVar107._20_4_ = auVar97._20_4_ * 0.0;
  auVar107._24_4_ = auVar97._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 + uVar69 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar83));
  auVar104._4_4_ = auVar97._4_4_ * auVar85._4_4_;
  auVar104._0_4_ = auVar97._0_4_ * auVar85._0_4_;
  auVar104._8_4_ = auVar97._8_4_ * auVar85._8_4_;
  auVar104._12_4_ = auVar97._12_4_ * auVar85._12_4_;
  auVar104._16_4_ = auVar97._16_4_ * 0.0;
  auVar104._20_4_ = auVar97._20_4_ * 0.0;
  auVar104._24_4_ = auVar97._24_4_ * 0.0;
  auVar104._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x17 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar83));
  auVar93._0_4_ = auVar85._0_4_ * auVar97._0_4_;
  auVar93._4_4_ = auVar85._4_4_ * auVar97._4_4_;
  auVar93._8_4_ = auVar85._8_4_ * auVar97._8_4_;
  auVar93._12_4_ = auVar85._12_4_ * auVar97._12_4_;
  auVar93._16_4_ = auVar97._16_4_ * 0.0;
  auVar93._20_4_ = auVar97._20_4_ * 0.0;
  auVar93._24_4_ = auVar97._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar97 = vpminsd_avx2(auVar102,auVar109);
  auVar96 = vpminsd_avx2(auVar103,auVar107);
  auVar97 = vmaxps_avx(auVar97,auVar96);
  auVar96 = vpminsd_avx2(auVar104,auVar93);
  uVar151 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar98._4_4_ = uVar151;
  auVar98._0_4_ = uVar151;
  auVar98._8_4_ = uVar151;
  auVar98._12_4_ = uVar151;
  auVar98._16_4_ = uVar151;
  auVar98._20_4_ = uVar151;
  auVar98._24_4_ = uVar151;
  auVar98._28_4_ = uVar151;
  auVar96 = vmaxps_avx512vl(auVar96,auVar98);
  auVar97 = vmaxps_avx(auVar97,auVar96);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  auVar96._16_4_ = 0x3f7ffffa;
  auVar96._20_4_ = 0x3f7ffffa;
  auVar96._24_4_ = 0x3f7ffffa;
  auVar96._28_4_ = 0x3f7ffffa;
  local_760 = vmulps_avx512vl(auVar97,auVar96);
  auVar97 = vpmaxsd_avx2(auVar102,auVar109);
  auVar96 = vpmaxsd_avx2(auVar103,auVar107);
  auVar97 = vminps_avx(auVar97,auVar96);
  auVar96 = vpmaxsd_avx2(auVar104,auVar93);
  uVar151 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar99._4_4_ = uVar151;
  auVar99._0_4_ = uVar151;
  auVar99._8_4_ = uVar151;
  auVar99._12_4_ = uVar151;
  auVar99._16_4_ = uVar151;
  auVar99._20_4_ = uVar151;
  auVar99._24_4_ = uVar151;
  auVar99._28_4_ = uVar151;
  auVar96 = vminps_avx512vl(auVar96,auVar99);
  auVar97 = vminps_avx(auVar97,auVar96);
  auVar100._8_4_ = 0x3f800003;
  auVar100._0_8_ = 0x3f8000033f800003;
  auVar100._12_4_ = 0x3f800003;
  auVar100._16_4_ = 0x3f800003;
  auVar100._20_4_ = 0x3f800003;
  auVar100._24_4_ = 0x3f800003;
  auVar100._28_4_ = 0x3f800003;
  auVar97 = vmulps_avx512vl(auVar97,auVar100);
  auVar96 = vpbroadcastd_avx512vl();
  uVar16 = vpcmpgtd_avx512vl(auVar96,_DAT_0205a920);
  uVar14 = vcmpps_avx512vl(local_760,auVar97,2);
  bVar79 = (byte)((byte)uVar14 & (byte)uVar16) == 0;
  bVar80 = !bVar79;
  if (bVar79) {
    return bVar80;
  }
  uVar76 = (ulong)(byte)((byte)uVar14 & (byte)uVar16);
  auVar170 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar170);
LAB_01d4ac52:
  iVar77 = 0;
  for (uVar69 = uVar76; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
    iVar77 = iVar77 + 1;
  }
  uVar76 = uVar76 - 1 & uVar76;
  uVar69 = (ulong)(uint)(iVar77 << 6);
  auVar12 = *(undefined1 (*) [16])(prim + uVar69 + lVar57 + 0x16);
  if (uVar76 != 0) {
    uVar71 = uVar76 - 1 & uVar76;
    for (uVar81 = uVar76; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
    }
    if (uVar71 != 0) {
      for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar13 = *(undefined1 (*) [16])(prim + uVar69 + lVar57 + 0x26);
  auVar85 = *(undefined1 (*) [16])(prim + uVar69 + lVar57 + 0x36);
  auVar197 = *(undefined1 (*) [16])(prim + uVar69 + lVar57 + 0x46);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar1 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar75 = *(uint *)(prim + 2);
  uVar151 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar91._4_4_ = uVar151;
  auVar91._0_4_ = uVar151;
  auVar91._8_4_ = uVar151;
  auVar91._12_4_ = uVar151;
  local_7e0._16_4_ = uVar151;
  local_7e0._0_16_ = auVar91;
  local_7e0._20_4_ = uVar151;
  local_7e0._24_4_ = uVar151;
  local_7e0._28_4_ = uVar151;
  auVar257 = ZEXT3264(local_7e0);
  uVar151 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar258._4_4_ = uVar151;
  auVar258._0_4_ = uVar151;
  auVar258._8_4_ = uVar151;
  auVar258._12_4_ = uVar151;
  local_800._16_4_ = uVar151;
  local_800._0_16_ = auVar258;
  local_800._20_4_ = uVar151;
  local_800._24_4_ = uVar151;
  local_800._28_4_ = uVar151;
  auVar259 = ZEXT3264(local_800);
  auVar83 = vunpcklps_avx(auVar91,auVar258);
  fVar244 = *(float *)(ray + k * 4 + 0x180);
  auVar260._4_4_ = fVar244;
  auVar260._0_4_ = fVar244;
  auVar260._8_4_ = fVar244;
  auVar260._12_4_ = fVar244;
  local_820._16_4_ = fVar244;
  local_820._0_16_ = auVar260;
  local_820._20_4_ = fVar244;
  local_820._24_4_ = fVar244;
  local_820._28_4_ = fVar244;
  local_a90 = vinsertps_avx(auVar83,auVar260,0x28);
  auVar245 = ZEXT1664(local_a90);
  auVar87._0_4_ = auVar12._0_4_ + auVar13._0_4_ + auVar85._0_4_ + auVar197._0_4_;
  auVar87._4_4_ = auVar12._4_4_ + auVar13._4_4_ + auVar85._4_4_ + auVar197._4_4_;
  auVar87._8_4_ = auVar12._8_4_ + auVar13._8_4_ + auVar85._8_4_ + auVar197._8_4_;
  auVar87._12_4_ = auVar12._12_4_ + auVar13._12_4_ + auVar85._12_4_ + auVar197._12_4_;
  auVar88._8_4_ = 0x3e800000;
  auVar88._0_8_ = 0x3e8000003e800000;
  auVar88._12_4_ = 0x3e800000;
  auVar83 = vmulps_avx512vl(auVar87,auVar88);
  auVar83 = vsubps_avx(auVar83,auVar1);
  auVar83 = vdpps_avx(auVar83,local_a90,0x7f);
  fVar150 = *(float *)(ray + k * 4 + 0xc0);
  auVar251 = ZEXT464((uint)fVar150);
  local_aa0 = vdpps_avx(local_a90,local_a90,0x7f);
  auVar253 = ZEXT1664(local_aa0);
  auVar89._4_12_ = ZEXT812(0) << 0x20;
  auVar89._0_4_ = local_aa0._0_4_;
  auVar84 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar89);
  auVar86 = vfnmadd213ss_fma(auVar84,local_aa0,ZEXT416(0x40000000));
  local_560 = auVar83._0_4_ * auVar84._0_4_ * auVar86._0_4_;
  auVar237 = ZEXT464((uint)local_560);
  auVar90._4_4_ = local_560;
  auVar90._0_4_ = local_560;
  auVar90._8_4_ = local_560;
  auVar90._12_4_ = local_560;
  fStack_950 = local_560;
  _local_960 = auVar90;
  fStack_94c = local_560;
  fStack_948 = local_560;
  fStack_944 = local_560;
  auVar83 = vfmadd231ps_fma(auVar1,local_a90,auVar90);
  auVar83 = vblendps_avx(auVar83,ZEXT816(0) << 0x40,8);
  auVar12 = vsubps_avx(auVar12,auVar83);
  auVar85 = vsubps_avx(auVar85,auVar83);
  auVar13 = vsubps_avx(auVar13,auVar83);
  auVar243 = ZEXT1664(auVar13);
  auVar197 = vsubps_avx(auVar197,auVar83);
  local_580 = vbroadcastss_avx512vl(auVar12);
  auVar116._8_4_ = 1;
  auVar116._0_8_ = 0x100000001;
  auVar116._12_4_ = 1;
  auVar116._16_4_ = 1;
  auVar116._20_4_ = 1;
  auVar116._24_4_ = 1;
  auVar116._28_4_ = 1;
  local_a20 = ZEXT1632(auVar12);
  local_5a0 = vpermps_avx512vl(auVar116,local_a20);
  auVar117._8_4_ = 2;
  auVar117._0_8_ = 0x200000002;
  auVar117._12_4_ = 2;
  auVar117._16_4_ = 2;
  auVar117._20_4_ = 2;
  auVar117._24_4_ = 2;
  auVar117._28_4_ = 2;
  local_5c0 = vpermps_avx512vl(auVar117,local_a20);
  auVar118._8_4_ = 3;
  auVar118._0_8_ = 0x300000003;
  auVar118._12_4_ = 3;
  auVar118._16_4_ = 3;
  auVar118._20_4_ = 3;
  auVar118._24_4_ = 3;
  auVar118._28_4_ = 3;
  local_5e0 = vpermps_avx512vl(auVar118,local_a20);
  local_600 = vbroadcastss_avx512vl(auVar13);
  local_a60 = ZEXT1632(auVar13);
  local_620 = vpermps_avx512vl(auVar116,local_a60);
  local_640 = vpermps_avx512vl(auVar117,local_a60);
  local_660 = vpermps_avx512vl(auVar118,local_a60);
  local_680 = vbroadcastss_avx512vl(auVar85);
  local_a40 = ZEXT1632(auVar85);
  local_6a0 = vpermps_avx512vl(auVar116,local_a40);
  local_6c0 = vpermps_avx512vl(auVar117,local_a40);
  local_6e0 = vpermps_avx512vl(auVar118,local_a40);
  local_700 = vbroadcastss_avx512vl(auVar197);
  _local_a80 = ZEXT1632(auVar197);
  _local_520 = vpermps_avx2(auVar116,_local_a80);
  local_840 = vpermps_avx512vl(auVar117,_local_a80);
  local_740 = vpermps_avx2(auVar118,_local_a80);
  auVar12 = vfmadd231ps_fma(ZEXT432((uint)(fVar244 * fVar244)),local_800,local_800);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_7e0,local_7e0);
  uVar151 = auVar12._0_4_;
  local_540._4_4_ = uVar151;
  local_540._0_4_ = uVar151;
  local_540._8_4_ = uVar151;
  local_540._12_4_ = uVar151;
  local_540._16_4_ = uVar151;
  local_540._20_4_ = uVar151;
  local_540._24_4_ = uVar151;
  local_540._28_4_ = uVar151;
  vandps_avx512vl(local_540,auVar261._0_32_);
  local_9f0 = ZEXT416((uint)local_560);
  local_560 = fVar150 - local_560;
  fStack_55c = local_560;
  fStack_558 = local_560;
  fStack_554 = local_560;
  fStack_550 = local_560;
  fStack_54c = local_560;
  fStack_548 = local_560;
  fStack_544 = local_560;
  auVar261 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar261);
  iVar77 = 1;
  bVar70 = 0;
  auVar261 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar261);
  auVar12 = vsqrtss_avx(local_aa0,local_aa0);
  auVar13 = vsqrtss_avx(local_aa0,local_aa0);
  auVar170 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  auVar97 = auVar261._32_32_;
  local_720 = local_840;
  uVar69 = 0;
  do {
    auVar197 = auVar170._0_16_;
    auVar85 = vmovshdup_avx(auVar197);
    fVar244 = auVar170._0_4_;
    fVar196 = auVar85._0_4_ - fVar244;
    fVar241 = fVar196 * 0.04761905;
    auVar230._4_4_ = fVar244;
    auVar230._0_4_ = fVar244;
    auVar230._8_4_ = fVar244;
    auVar230._12_4_ = fVar244;
    auVar230._16_4_ = fVar244;
    auVar230._20_4_ = fVar244;
    auVar230._24_4_ = fVar244;
    auVar230._28_4_ = fVar244;
    local_ac0._4_4_ = fVar196;
    local_ac0._0_4_ = fVar196;
    local_ac0._8_4_ = fVar196;
    local_ac0._12_4_ = fVar196;
    local_ac0._16_4_ = fVar196;
    local_ac0._20_4_ = fVar196;
    local_ac0._24_4_ = fVar196;
    local_ac0._28_4_ = fVar196;
    auVar85 = vfmadd231ps_fma(auVar230,local_ac0,_DAT_02020f20);
    auVar96 = vsubps_avx(auVar224._0_32_,ZEXT1632(auVar85));
    fVar244 = auVar96._0_4_;
    fVar247 = auVar96._4_4_;
    fVar239 = auVar96._8_4_;
    fVar249 = auVar96._12_4_;
    fVar235 = auVar96._16_4_;
    fVar250 = auVar96._20_4_;
    fVar236 = auVar96._24_4_;
    fVar152 = fVar244 * fVar244 * fVar244;
    fVar171 = fVar247 * fVar247 * fVar247;
    auVar126._4_4_ = fVar171;
    auVar126._0_4_ = fVar152;
    fVar172 = fVar239 * fVar239 * fVar239;
    auVar126._8_4_ = fVar172;
    fVar173 = fVar249 * fVar249 * fVar249;
    auVar126._12_4_ = fVar173;
    fVar174 = fVar235 * fVar235 * fVar235;
    auVar126._16_4_ = fVar174;
    fVar175 = fVar250 * fVar250 * fVar250;
    auVar126._20_4_ = fVar175;
    fVar176 = fVar236 * fVar236 * fVar236;
    auVar126._24_4_ = fVar176;
    auVar126._28_4_ = fVar196;
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar99 = vmulps_avx512vl(auVar126,auVar98);
    fVar246 = auVar85._0_4_;
    fVar248 = auVar85._4_4_;
    fVar240 = auVar85._8_4_;
    fVar215 = auVar85._12_4_;
    fVar195 = fVar246 * fVar246 * fVar246;
    fVar212 = fVar248 * fVar248 * fVar248;
    fVar213 = fVar240 * fVar240 * fVar240;
    fVar214 = fVar215 * fVar215 * fVar215;
    auVar261._28_36_ = auVar170._28_36_;
    auVar261._0_28_ = ZEXT1628(CONCAT412(fVar214,CONCAT48(fVar213,CONCAT44(fVar212,fVar195))));
    auVar224._0_4_ = fVar246 * fVar244;
    auVar224._4_4_ = fVar248 * fVar247;
    auVar224._8_4_ = fVar240 * fVar239;
    auVar224._12_4_ = fVar215 * fVar249;
    auVar224._16_4_ = fVar235 * 0.0;
    auVar224._20_4_ = fVar250 * 0.0;
    auVar224._28_36_ = auVar251._28_36_;
    auVar224._24_4_ = fVar236 * 0.0;
    auVar100 = vmulps_avx512vl(auVar261._0_32_,auVar98);
    fVar254 = auVar100._28_4_ + fVar196;
    fVar31 = auVar257._28_4_;
    fVar238 = fVar254 + fVar31 + auVar237._28_4_;
    auVar127._4_4_ = fVar171 * 0.16666667;
    auVar127._0_4_ = fVar152 * 0.16666667;
    auVar127._8_4_ = fVar172 * 0.16666667;
    auVar127._12_4_ = fVar173 * 0.16666667;
    auVar127._16_4_ = fVar174 * 0.16666667;
    auVar127._20_4_ = fVar175 * 0.16666667;
    auVar127._24_4_ = fVar176 * 0.16666667;
    auVar127._28_4_ = fVar254;
    auVar32._4_4_ =
         (auVar224._4_4_ * fVar247 * 12.0 + auVar224._4_4_ * fVar248 * 6.0 + fVar212 + auVar99._4_4_
         ) * 0.16666667;
    auVar32._0_4_ =
         (auVar224._0_4_ * fVar244 * 12.0 + auVar224._0_4_ * fVar246 * 6.0 + fVar195 + auVar99._0_4_
         ) * 0.16666667;
    auVar32._8_4_ =
         (auVar224._8_4_ * fVar239 * 12.0 + auVar224._8_4_ * fVar240 * 6.0 + fVar213 + auVar99._8_4_
         ) * 0.16666667;
    auVar32._12_4_ =
         (auVar224._12_4_ * fVar249 * 12.0 + auVar224._12_4_ * fVar215 * 6.0 +
         fVar214 + auVar99._12_4_) * 0.16666667;
    auVar32._16_4_ =
         (auVar224._16_4_ * fVar235 * 12.0 + auVar224._16_4_ * 0.0 * 6.0 + auVar99._16_4_ + 0.0) *
         0.16666667;
    auVar32._20_4_ =
         (auVar224._20_4_ * fVar250 * 12.0 + auVar224._20_4_ * 0.0 * 6.0 + auVar99._20_4_ + 0.0) *
         0.16666667;
    auVar32._24_4_ =
         (auVar224._24_4_ * fVar236 * 12.0 + auVar224._24_4_ * 0.0 * 6.0 + auVar99._24_4_ + 0.0) *
         0.16666667;
    auVar32._28_4_ = fVar31;
    auVar33._4_4_ =
         (auVar100._4_4_ + fVar171 +
         auVar224._4_4_ * fVar248 * 12.0 + auVar224._4_4_ * fVar247 * 6.0) * 0.16666667;
    auVar33._0_4_ =
         (auVar100._0_4_ + fVar152 +
         auVar224._0_4_ * fVar246 * 12.0 + auVar224._0_4_ * fVar244 * 6.0) * 0.16666667;
    auVar33._8_4_ =
         (auVar100._8_4_ + fVar172 +
         auVar224._8_4_ * fVar240 * 12.0 + auVar224._8_4_ * fVar239 * 6.0) * 0.16666667;
    auVar33._12_4_ =
         (auVar100._12_4_ + fVar173 +
         auVar224._12_4_ * fVar215 * 12.0 + auVar224._12_4_ * fVar249 * 6.0) * 0.16666667;
    auVar33._16_4_ =
         (auVar100._16_4_ + fVar174 + auVar224._16_4_ * 0.0 * 12.0 + auVar224._16_4_ * fVar235 * 6.0
         ) * 0.16666667;
    auVar33._20_4_ =
         (auVar100._20_4_ + fVar175 + auVar224._20_4_ * 0.0 * 12.0 + auVar224._20_4_ * fVar250 * 6.0
         ) * 0.16666667;
    auVar33._24_4_ =
         (auVar100._24_4_ + fVar176 + auVar224._24_4_ * 0.0 * 12.0 + auVar224._24_4_ * fVar236 * 6.0
         ) * 0.16666667;
    auVar33._28_4_ = auVar259._28_4_;
    fVar195 = fVar195 * 0.16666667;
    fVar212 = fVar212 * 0.16666667;
    fVar213 = fVar213 * 0.16666667;
    fVar214 = fVar214 * 0.16666667;
    auVar34._28_4_ = fVar238;
    auVar34._0_28_ = ZEXT1628(CONCAT412(fVar214,CONCAT48(fVar213,CONCAT44(fVar212,fVar195))));
    auVar100 = vmulps_avx512vl(local_700,auVar34);
    auVar35._4_4_ = (float)local_520._4_4_ * fVar212;
    auVar35._0_4_ = (float)local_520._0_4_ * fVar195;
    auVar35._8_4_ = fStack_518 * fVar213;
    auVar35._12_4_ = fStack_514 * fVar214;
    auVar35._16_4_ = fStack_510 * 0.0;
    auVar35._20_4_ = fStack_50c * 0.0;
    auVar35._24_4_ = fStack_508 * 0.0;
    auVar35._28_4_ = auVar253._28_4_ + auVar259._28_4_ + auVar170._28_4_ + auVar99._28_4_;
    auVar99 = vmulps_avx512vl(local_720,auVar34);
    auVar36._4_4_ = local_740._4_4_ * fVar212;
    auVar36._0_4_ = local_740._0_4_ * fVar195;
    auVar36._8_4_ = local_740._8_4_ * fVar213;
    auVar36._12_4_ = local_740._12_4_ * fVar214;
    auVar36._16_4_ = local_740._16_4_ * 0.0;
    auVar36._20_4_ = local_740._20_4_ * 0.0;
    auVar36._24_4_ = local_740._24_4_ * 0.0;
    auVar36._28_4_ = fVar238;
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar33,local_680);
    auVar101 = vfmadd231ps_avx512vl(auVar35,auVar33,local_6a0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar33,local_6c0);
    auVar102 = vfmadd231ps_avx512vl(auVar36,local_6e0,auVar33);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar32,local_600);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar32,local_620);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar32,local_640);
    auVar102 = vfmadd231ps_avx512vl(auVar102,local_660,auVar32);
    auVar103 = vfmadd231ps_avx512vl(auVar100,auVar127,local_580);
    auVar104 = vfmadd231ps_avx512vl(auVar101,auVar127,local_5a0);
    auVar105 = vfmadd231ps_avx512vl(auVar99,auVar127,local_5c0);
    auVar99 = vfmadd231ps_avx512vl(auVar102,local_5e0,auVar127);
    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar101 = vxorps_avx512vl(auVar96,auVar100);
    auVar100 = vxorps_avx512vl(ZEXT1632(auVar85),auVar100);
    auVar231._0_4_ = auVar100._0_4_ * fVar246;
    auVar231._4_4_ = auVar100._4_4_ * fVar248;
    auVar231._8_4_ = auVar100._8_4_ * fVar240;
    auVar231._12_4_ = auVar100._12_4_ * fVar215;
    auVar231._16_4_ = auVar100._16_4_ * 0.0;
    auVar231._20_4_ = auVar100._20_4_ * 0.0;
    auVar231._24_4_ = auVar100._24_4_ * 0.0;
    auVar231._28_4_ = 0;
    auVar102 = vmulps_avx512vl(auVar224._0_32_,auVar98);
    auVar98 = vsubps_avx(auVar231,auVar102);
    auVar37._4_4_ = auVar101._4_4_ * fVar247 * 0.5;
    auVar37._0_4_ = auVar101._0_4_ * fVar244 * 0.5;
    auVar37._8_4_ = auVar101._8_4_ * fVar239 * 0.5;
    auVar37._12_4_ = auVar101._12_4_ * fVar249 * 0.5;
    auVar37._16_4_ = auVar101._16_4_ * fVar235 * 0.5;
    auVar37._20_4_ = auVar101._20_4_ * fVar250 * 0.5;
    auVar37._24_4_ = auVar101._24_4_ * fVar236 * 0.5;
    auVar37._28_4_ = auVar96._28_4_;
    auVar38._4_4_ = auVar98._4_4_ * 0.5;
    auVar38._0_4_ = auVar98._0_4_ * 0.5;
    auVar38._8_4_ = auVar98._8_4_ * 0.5;
    auVar38._12_4_ = auVar98._12_4_ * 0.5;
    auVar38._16_4_ = auVar98._16_4_ * 0.5;
    auVar38._20_4_ = auVar98._20_4_ * 0.5;
    auVar38._24_4_ = auVar98._24_4_ * 0.5;
    auVar38._28_4_ = auVar98._28_4_;
    auVar39._4_4_ = (fVar247 * fVar247 + auVar102._4_4_) * 0.5;
    auVar39._0_4_ = (fVar244 * fVar244 + auVar102._0_4_) * 0.5;
    auVar39._8_4_ = (fVar239 * fVar239 + auVar102._8_4_) * 0.5;
    auVar39._12_4_ = (fVar249 * fVar249 + auVar102._12_4_) * 0.5;
    auVar39._16_4_ = (fVar235 * fVar235 + auVar102._16_4_) * 0.5;
    auVar39._20_4_ = (fVar250 * fVar250 + auVar102._20_4_) * 0.5;
    auVar39._24_4_ = (fVar236 * fVar236 + auVar102._24_4_) * 0.5;
    auVar39._28_4_ = auVar243._28_4_ + auVar102._28_4_;
    fVar244 = fVar246 * fVar246 * 0.5;
    fVar246 = fVar248 * fVar248 * 0.5;
    fVar247 = fVar240 * fVar240 * 0.5;
    fVar248 = fVar215 * fVar215 * 0.5;
    auVar40._28_4_ = auVar245._28_4_;
    auVar40._0_28_ = ZEXT1628(CONCAT412(fVar248,CONCAT48(fVar247,CONCAT44(fVar246,fVar244))));
    auVar96 = vmulps_avx512vl(local_700,auVar40);
    auVar41._4_4_ = fVar246 * (float)local_520._4_4_;
    auVar41._0_4_ = fVar244 * (float)local_520._0_4_;
    auVar41._8_4_ = fVar247 * fStack_518;
    auVar41._12_4_ = fVar248 * fStack_514;
    auVar41._16_4_ = fStack_510 * 0.0;
    auVar41._20_4_ = fStack_50c * 0.0;
    auVar41._24_4_ = fStack_508 * 0.0;
    auVar41._28_4_ = fVar31;
    auVar98 = vmulps_avx512vl(local_720,auVar40);
    auVar42._4_4_ = fVar246 * local_740._4_4_;
    auVar42._0_4_ = fVar244 * local_740._0_4_;
    auVar42._8_4_ = fVar247 * local_740._8_4_;
    auVar42._12_4_ = fVar248 * local_740._12_4_;
    auVar42._16_4_ = local_740._16_4_ * 0.0;
    auVar42._20_4_ = local_740._20_4_ * 0.0;
    auVar42._24_4_ = local_740._24_4_ * 0.0;
    auVar42._28_4_ = auVar245._28_4_;
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar39,local_680);
    auVar101 = vfmadd231ps_avx512vl(auVar41,auVar39,local_6a0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar39,local_6c0);
    auVar102 = vfmadd231ps_avx512vl(auVar42,local_6e0,auVar39);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar38,local_600);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar38,local_620);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar38,local_640);
    auVar102 = vfmadd231ps_avx512vl(auVar102,local_660,auVar38);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar37,local_580);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar37,local_5a0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar37,local_5c0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,local_5e0,auVar37);
    auVar43._4_4_ = auVar96._4_4_ * fVar241;
    auVar43._0_4_ = auVar96._0_4_ * fVar241;
    auVar43._8_4_ = auVar96._8_4_ * fVar241;
    auVar43._12_4_ = auVar96._12_4_ * fVar241;
    auVar43._16_4_ = auVar96._16_4_ * fVar241;
    auVar43._20_4_ = auVar96._20_4_ * fVar241;
    auVar43._24_4_ = auVar96._24_4_ * fVar241;
    auVar43._28_4_ = auVar100._28_4_;
    auVar253 = ZEXT3264(auVar43);
    auVar44._4_4_ = auVar101._4_4_ * fVar241;
    auVar44._0_4_ = auVar101._0_4_ * fVar241;
    auVar44._8_4_ = auVar101._8_4_ * fVar241;
    auVar44._12_4_ = auVar101._12_4_ * fVar241;
    auVar44._16_4_ = auVar101._16_4_ * fVar241;
    auVar44._20_4_ = auVar101._20_4_ * fVar241;
    auVar44._24_4_ = auVar101._24_4_ * fVar241;
    auVar44._28_4_ = auVar101._28_4_;
    auVar257 = ZEXT3264(auVar44);
    auVar45._4_4_ = auVar98._4_4_ * fVar241;
    auVar45._0_4_ = auVar98._0_4_ * fVar241;
    auVar45._8_4_ = auVar98._8_4_ * fVar241;
    auVar45._12_4_ = auVar98._12_4_ * fVar241;
    auVar45._16_4_ = auVar98._16_4_ * fVar241;
    auVar45._20_4_ = auVar98._20_4_ * fVar241;
    auVar45._24_4_ = auVar98._24_4_ * fVar241;
    auVar45._28_4_ = auVar98._28_4_;
    auVar259 = ZEXT3264(auVar45);
    fVar244 = auVar102._0_4_ * fVar241;
    fVar246 = auVar102._4_4_ * fVar241;
    auVar46._4_4_ = fVar246;
    auVar46._0_4_ = fVar244;
    fVar247 = auVar102._8_4_ * fVar241;
    auVar46._8_4_ = fVar247;
    fVar248 = auVar102._12_4_ * fVar241;
    auVar46._12_4_ = fVar248;
    fVar239 = auVar102._16_4_ * fVar241;
    auVar46._16_4_ = fVar239;
    fVar240 = auVar102._20_4_ * fVar241;
    auVar46._20_4_ = fVar240;
    fVar241 = auVar102._24_4_ * fVar241;
    auVar46._24_4_ = fVar241;
    auVar46._28_4_ = local_740._28_4_;
    auVar85 = vxorps_avx512vl(local_6e0._0_16_,local_6e0._0_16_);
    auVar102 = vpermt2ps_avx512vl(auVar103,_DAT_0205fd20,ZEXT1632(auVar85));
    auVar243 = ZEXT3264(auVar102);
    auVar94 = vpermt2ps_avx512vl(auVar104,_DAT_0205fd20,ZEXT1632(auVar85));
    auVar245 = ZEXT3264(auVar94);
    auVar100 = ZEXT1632(auVar85);
    auVar95 = vpermt2ps_avx512vl(auVar105,_DAT_0205fd20,auVar100);
    auVar251 = ZEXT3264(auVar95);
    auVar232._0_4_ = fVar244 + auVar99._0_4_;
    auVar232._4_4_ = fVar246 + auVar99._4_4_;
    auVar232._8_4_ = fVar247 + auVar99._8_4_;
    auVar232._12_4_ = fVar248 + auVar99._12_4_;
    auVar232._16_4_ = fVar239 + auVar99._16_4_;
    auVar232._20_4_ = fVar240 + auVar99._20_4_;
    auVar232._24_4_ = fVar241 + auVar99._24_4_;
    auVar232._28_4_ = local_740._28_4_ + auVar99._28_4_;
    auVar96 = vmaxps_avx(auVar99,auVar232);
    auVar98 = vminps_avx(auVar99,auVar232);
    auVar106 = vpermt2ps_avx512vl(auVar99,_DAT_0205fd20,auVar100);
    auVar92 = vpermt2ps_avx512vl(auVar43,_DAT_0205fd20,auVar100);
    auVar93 = vpermt2ps_avx512vl(auVar44,_DAT_0205fd20,auVar100);
    auVar126 = ZEXT1632(auVar85);
    auVar107 = vpermt2ps_avx512vl(auVar45,_DAT_0205fd20,auVar126);
    auVar99 = vpermt2ps_avx512vl(auVar46,_DAT_0205fd20,auVar126);
    auVar108 = vsubps_avx512vl(auVar106,auVar99);
    auVar99 = vsubps_avx(auVar102,auVar103);
    auVar100 = vsubps_avx(auVar94,auVar104);
    auVar101 = vsubps_avx(auVar95,auVar105);
    auVar237 = ZEXT3264(auVar101);
    auVar109 = vmulps_avx512vl(auVar100,auVar45);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar44,auVar101);
    auVar110 = vmulps_avx512vl(auVar101,auVar43);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar45,auVar99);
    auVar111 = vmulps_avx512vl(auVar99,auVar44);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar43,auVar100);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar110 = vmulps_avx512vl(auVar101,auVar101);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar100,auVar100);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar99,auVar99);
    auVar111 = vrcp14ps_avx512vl(auVar110);
    auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar113 = vfnmadd213ps_avx512vl(auVar111,auVar110,auVar112);
    auVar111 = vfmadd132ps_avx512vl(auVar113,auVar111,auVar111);
    auVar109 = vmulps_avx512vl(auVar109,auVar111);
    auVar113 = vmulps_avx512vl(auVar100,auVar107);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar93,auVar101);
    auVar114 = vmulps_avx512vl(auVar101,auVar92);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar107,auVar99);
    auVar115 = vmulps_avx512vl(auVar99,auVar93);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar92,auVar100);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar111 = vmulps_avx512vl(auVar113,auVar111);
    auVar109 = vmaxps_avx512vl(auVar109,auVar111);
    auVar109 = vsqrtps_avx512vl(auVar109);
    auVar111 = vmaxps_avx512vl(auVar108,auVar106);
    auVar96 = vmaxps_avx512vl(auVar96,auVar111);
    auVar111 = vaddps_avx512vl(auVar109,auVar96);
    auVar96 = vminps_avx512vl(auVar108,auVar106);
    auVar96 = vminps_avx(auVar98,auVar96);
    auVar96 = vsubps_avx512vl(auVar96,auVar109);
    auVar119._8_4_ = 0x3f800002;
    auVar119._0_8_ = 0x3f8000023f800002;
    auVar119._12_4_ = 0x3f800002;
    auVar119._16_4_ = 0x3f800002;
    auVar119._20_4_ = 0x3f800002;
    auVar119._24_4_ = 0x3f800002;
    auVar119._28_4_ = 0x3f800002;
    auVar98 = vmulps_avx512vl(auVar111,auVar119);
    auVar120._8_4_ = 0x3f7ffffc;
    auVar120._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar120._12_4_ = 0x3f7ffffc;
    auVar120._16_4_ = 0x3f7ffffc;
    auVar120._20_4_ = 0x3f7ffffc;
    auVar120._24_4_ = 0x3f7ffffc;
    auVar120._28_4_ = 0x3f7ffffc;
    auVar106 = vmulps_avx512vl(auVar96,auVar120);
    auVar47._4_4_ = auVar98._4_4_ * auVar98._4_4_;
    auVar47._0_4_ = auVar98._0_4_ * auVar98._0_4_;
    auVar47._8_4_ = auVar98._8_4_ * auVar98._8_4_;
    auVar47._12_4_ = auVar98._12_4_ * auVar98._12_4_;
    auVar47._16_4_ = auVar98._16_4_ * auVar98._16_4_;
    auVar47._20_4_ = auVar98._20_4_ * auVar98._20_4_;
    auVar47._24_4_ = auVar98._24_4_ * auVar98._24_4_;
    auVar47._28_4_ = auVar106._28_4_;
    auVar96 = vrsqrt14ps_avx512vl(auVar110);
    auVar121._8_4_ = 0xbf000000;
    auVar121._0_8_ = 0xbf000000bf000000;
    auVar121._12_4_ = 0xbf000000;
    auVar121._16_4_ = 0xbf000000;
    auVar121._20_4_ = 0xbf000000;
    auVar121._24_4_ = 0xbf000000;
    auVar121._28_4_ = 0xbf000000;
    auVar98 = vmulps_avx512vl(auVar110,auVar121);
    auVar48._4_4_ = auVar96._4_4_ * auVar98._4_4_;
    auVar48._0_4_ = auVar96._0_4_ * auVar98._0_4_;
    auVar48._8_4_ = auVar96._8_4_ * auVar98._8_4_;
    auVar48._12_4_ = auVar96._12_4_ * auVar98._12_4_;
    auVar48._16_4_ = auVar96._16_4_ * auVar98._16_4_;
    auVar48._20_4_ = auVar96._20_4_ * auVar98._20_4_;
    auVar48._24_4_ = auVar96._24_4_ * auVar98._24_4_;
    auVar48._28_4_ = auVar98._28_4_;
    auVar98 = vmulps_avx512vl(auVar96,auVar96);
    auVar98 = vmulps_avx512vl(auVar98,auVar48);
    auVar124._8_4_ = 0x3fc00000;
    auVar124._0_8_ = 0x3fc000003fc00000;
    auVar124._12_4_ = 0x3fc00000;
    auVar124._16_4_ = 0x3fc00000;
    auVar124._20_4_ = 0x3fc00000;
    auVar124._24_4_ = 0x3fc00000;
    auVar124._28_4_ = 0x3fc00000;
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar96,auVar124);
    auVar49._4_4_ = auVar98._4_4_ * auVar99._4_4_;
    auVar49._0_4_ = auVar98._0_4_ * auVar99._0_4_;
    auVar49._8_4_ = auVar98._8_4_ * auVar99._8_4_;
    auVar49._12_4_ = auVar98._12_4_ * auVar99._12_4_;
    auVar49._16_4_ = auVar98._16_4_ * auVar99._16_4_;
    auVar49._20_4_ = auVar98._20_4_ * auVar99._20_4_;
    auVar49._24_4_ = auVar98._24_4_ * auVar99._24_4_;
    auVar49._28_4_ = auVar96._28_4_;
    auVar96 = vmulps_avx512vl(auVar100,auVar98);
    auVar108 = vmulps_avx512vl(auVar101,auVar98);
    auVar109 = vsubps_avx512vl(auVar126,auVar103);
    auVar110 = vsubps_avx512vl(auVar126,auVar104);
    auVar111 = vsubps_avx512vl(auVar126,auVar105);
    auVar113 = vmulps_avx512vl(local_820,auVar111);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_800,auVar110);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_7e0,auVar109);
    auVar114 = vmulps_avx512vl(auVar111,auVar111);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar110,auVar110);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar109,auVar109);
    auVar115 = vmulps_avx512vl(local_820,auVar108);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar96,local_800);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar49,local_7e0);
    auVar108 = vmulps_avx512vl(auVar111,auVar108);
    auVar96 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar96);
    auVar108 = vfmadd231ps_avx512vl(auVar96,auVar109,auVar49);
    auVar116 = vmulps_avx512vl(auVar115,auVar115);
    auVar117 = vsubps_avx512vl(local_540,auVar116);
    auVar96 = vmulps_avx512vl(auVar115,auVar108);
    auVar96 = vsubps_avx512vl(auVar113,auVar96);
    auVar113 = vaddps_avx512vl(auVar96,auVar96);
    auVar96 = vmulps_avx512vl(auVar108,auVar108);
    local_ae0 = vsubps_avx512vl(auVar114,auVar96);
    auVar96 = vsubps_avx(local_ae0,auVar47);
    auVar114 = vmulps_avx512vl(auVar113,auVar113);
    auVar125._8_4_ = 0x40800000;
    auVar125._0_8_ = 0x4080000040800000;
    auVar125._12_4_ = 0x40800000;
    auVar125._16_4_ = 0x40800000;
    auVar125._20_4_ = 0x40800000;
    auVar125._24_4_ = 0x40800000;
    auVar125._28_4_ = 0x40800000;
    auVar118 = vmulps_avx512vl(auVar117,auVar125);
    auVar119 = vmulps_avx512vl(auVar118,auVar96);
    auVar119 = vsubps_avx512vl(auVar114,auVar119);
    uVar81 = vcmpps_avx512vl(auVar119,auVar126,5);
    bVar66 = (byte)uVar81;
    if (bVar66 == 0) {
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar119 = vsqrtps_avx512vl(auVar119);
      auVar120 = vaddps_avx512vl(auVar117,auVar117);
      auVar121 = vrcp14ps_avx512vl(auVar120);
      auVar120 = vfnmadd213ps_avx512vl(auVar120,auVar121,auVar112);
      auVar120 = vfmadd132ps_avx512vl(auVar120,auVar121,auVar121);
      auVar20._8_4_ = 0x80000000;
      auVar20._0_8_ = 0x8000000080000000;
      auVar20._12_4_ = 0x80000000;
      auVar20._16_4_ = 0x80000000;
      auVar20._20_4_ = 0x80000000;
      auVar20._24_4_ = 0x80000000;
      auVar20._28_4_ = 0x80000000;
      auVar121 = vxorps_avx512vl(auVar113,auVar20);
      auVar121 = vsubps_avx512vl(auVar121,auVar119);
      auVar121 = vmulps_avx512vl(auVar121,auVar120);
      auVar119 = vsubps_avx512vl(auVar119,auVar113);
      auVar119 = vmulps_avx512vl(auVar119,auVar120);
      auVar120 = vfmadd213ps_avx512vl(auVar115,auVar121,auVar108);
      local_880 = vmulps_avx512vl(auVar98,auVar120);
      auVar120 = vfmadd213ps_avx512vl(auVar115,auVar119,auVar108);
      local_8a0 = vmulps_avx512vl(auVar98,auVar120);
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar120 = vblendmps_avx512vl(auVar120,auVar121);
      auVar122._0_4_ =
           (uint)(bVar66 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar66 & 1) * local_8a0._0_4_;
      bVar79 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar79 * auVar120._4_4_ | (uint)!bVar79 * local_8a0._4_4_;
      bVar79 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar79 * auVar120._8_4_ | (uint)!bVar79 * local_8a0._8_4_;
      bVar79 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar79 * auVar120._12_4_ | (uint)!bVar79 * local_8a0._12_4_;
      bVar79 = (bool)((byte)(uVar81 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar79 * auVar120._16_4_ | (uint)!bVar79 * local_8a0._16_4_;
      bVar79 = (bool)((byte)(uVar81 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar79 * auVar120._20_4_ | (uint)!bVar79 * local_8a0._20_4_;
      bVar79 = (bool)((byte)(uVar81 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar79 * auVar120._24_4_ | (uint)!bVar79 * local_8a0._24_4_;
      bVar79 = SUB81(uVar81 >> 7,0);
      auVar122._28_4_ = (uint)bVar79 * auVar120._28_4_ | (uint)!bVar79 * local_8a0._28_4_;
      auVar220._8_4_ = 0xff800000;
      auVar220._0_8_ = 0xff800000ff800000;
      auVar220._12_4_ = 0xff800000;
      auVar220._16_4_ = 0xff800000;
      auVar220._20_4_ = 0xff800000;
      auVar220._24_4_ = 0xff800000;
      auVar220._28_4_ = 0xff800000;
      auVar120 = vblendmps_avx512vl(auVar220,auVar119);
      auVar123._0_4_ =
           (uint)(bVar66 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar119._0_4_;
      bVar79 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar79 * auVar120._4_4_ | (uint)!bVar79 * auVar119._4_4_;
      bVar79 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar79 * auVar120._8_4_ | (uint)!bVar79 * auVar119._8_4_;
      bVar79 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar79 * auVar120._12_4_ | (uint)!bVar79 * auVar119._12_4_;
      bVar79 = (bool)((byte)(uVar81 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar79 * auVar120._16_4_ | (uint)!bVar79 * auVar119._16_4_;
      bVar79 = (bool)((byte)(uVar81 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar79 * auVar120._20_4_ | (uint)!bVar79 * auVar119._20_4_;
      bVar79 = (bool)((byte)(uVar81 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar79 * auVar120._24_4_ | (uint)!bVar79 * auVar119._24_4_;
      bVar79 = SUB81(uVar81 >> 7,0);
      auVar123._28_4_ = (uint)bVar79 * auVar120._28_4_ | (uint)!bVar79 * auVar119._28_4_;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar116,auVar119);
      auVar120 = vmaxps_avx512vl(local_840,auVar119);
      auVar21._8_4_ = 0x36000000;
      auVar21._0_8_ = 0x3600000036000000;
      auVar21._12_4_ = 0x36000000;
      auVar21._16_4_ = 0x36000000;
      auVar21._20_4_ = 0x36000000;
      auVar21._24_4_ = 0x36000000;
      auVar21._28_4_ = 0x36000000;
      auVar120 = vmulps_avx512vl(auVar120,auVar21);
      vandps_avx512vl(auVar117,auVar119);
      uVar71 = vcmpps_avx512vl(auVar120,auVar120,1);
      uVar81 = uVar81 & uVar71;
      bVar73 = (byte)uVar81;
      if (bVar73 != 0) {
        uVar71 = vcmpps_avx512vl(auVar96,_DAT_02020f00,2);
        auVar234._8_4_ = 0xff800000;
        auVar234._0_8_ = 0xff800000ff800000;
        auVar234._12_4_ = 0xff800000;
        auVar234._16_4_ = 0xff800000;
        auVar234._20_4_ = 0xff800000;
        auVar234._24_4_ = 0xff800000;
        auVar234._28_4_ = 0xff800000;
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar119 = vblendmps_avx512vl(auVar96,auVar234);
        bVar68 = (byte)uVar71;
        uVar82 = (uint)(bVar68 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar120._0_4_;
        bVar79 = (bool)((byte)(uVar71 >> 1) & 1);
        uVar143 = (uint)bVar79 * auVar119._4_4_ | (uint)!bVar79 * auVar120._4_4_;
        bVar79 = (bool)((byte)(uVar71 >> 2) & 1);
        uVar144 = (uint)bVar79 * auVar119._8_4_ | (uint)!bVar79 * auVar120._8_4_;
        bVar79 = (bool)((byte)(uVar71 >> 3) & 1);
        uVar145 = (uint)bVar79 * auVar119._12_4_ | (uint)!bVar79 * auVar120._12_4_;
        bVar79 = (bool)((byte)(uVar71 >> 4) & 1);
        uVar146 = (uint)bVar79 * auVar119._16_4_ | (uint)!bVar79 * auVar120._16_4_;
        bVar79 = (bool)((byte)(uVar71 >> 5) & 1);
        uVar147 = (uint)bVar79 * auVar119._20_4_ | (uint)!bVar79 * auVar120._20_4_;
        bVar79 = (bool)((byte)(uVar71 >> 6) & 1);
        uVar148 = (uint)bVar79 * auVar119._24_4_ | (uint)!bVar79 * auVar120._24_4_;
        bVar79 = SUB81(uVar71 >> 7,0);
        uVar149 = (uint)bVar79 * auVar119._28_4_ | (uint)!bVar79 * auVar120._28_4_;
        auVar122._0_4_ = (bVar73 & 1) * uVar82 | !(bool)(bVar73 & 1) * auVar122._0_4_;
        bVar79 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar122._4_4_ = bVar79 * uVar143 | !bVar79 * auVar122._4_4_;
        bVar79 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar122._8_4_ = bVar79 * uVar144 | !bVar79 * auVar122._8_4_;
        bVar79 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar122._12_4_ = bVar79 * uVar145 | !bVar79 * auVar122._12_4_;
        bVar79 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar122._16_4_ = bVar79 * uVar146 | !bVar79 * auVar122._16_4_;
        bVar79 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar122._20_4_ = bVar79 * uVar147 | !bVar79 * auVar122._20_4_;
        bVar79 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar122._24_4_ = bVar79 * uVar148 | !bVar79 * auVar122._24_4_;
        bVar79 = SUB81(uVar81 >> 7,0);
        auVar122._28_4_ = bVar79 * uVar149 | !bVar79 * auVar122._28_4_;
        auVar96 = vblendmps_avx512vl(auVar234,auVar96);
        bVar79 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar71 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar71 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar71 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar71 >> 6) & 1);
        bVar11 = SUB81(uVar71 >> 7,0);
        auVar123._0_4_ =
             (uint)(bVar73 & 1) *
             ((uint)(bVar68 & 1) * auVar96._0_4_ | !(bool)(bVar68 & 1) * uVar82) |
             !(bool)(bVar73 & 1) * auVar123._0_4_;
        bVar5 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar123._4_4_ =
             (uint)bVar5 * ((uint)bVar79 * auVar96._4_4_ | !bVar79 * uVar143) |
             !bVar5 * auVar123._4_4_;
        bVar79 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar123._8_4_ =
             (uint)bVar79 * ((uint)bVar6 * auVar96._8_4_ | !bVar6 * uVar144) |
             !bVar79 * auVar123._8_4_;
        bVar79 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar123._12_4_ =
             (uint)bVar79 * ((uint)bVar7 * auVar96._12_4_ | !bVar7 * uVar145) |
             !bVar79 * auVar123._12_4_;
        bVar79 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar123._16_4_ =
             (uint)bVar79 * ((uint)bVar8 * auVar96._16_4_ | !bVar8 * uVar146) |
             !bVar79 * auVar123._16_4_;
        bVar79 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar123._20_4_ =
             (uint)bVar79 * ((uint)bVar9 * auVar96._20_4_ | !bVar9 * uVar147) |
             !bVar79 * auVar123._20_4_;
        bVar79 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar123._24_4_ =
             (uint)bVar79 * ((uint)bVar10 * auVar96._24_4_ | !bVar10 * uVar148) |
             !bVar79 * auVar123._24_4_;
        bVar79 = SUB81(uVar81 >> 7,0);
        auVar123._28_4_ =
             (uint)bVar79 * ((uint)bVar11 * auVar96._28_4_ | !bVar11 * uVar149) |
             !bVar79 * auVar123._28_4_;
        bVar66 = (~bVar73 | bVar68) & bVar66;
      }
      auVar112._8_4_ = 0x3f800000;
      auVar112._0_8_ = &DAT_3f8000003f800000;
      auVar112._12_4_ = 0x3f800000;
      auVar112._16_4_ = 0x3f800000;
      auVar112._20_4_ = 0x3f800000;
      auVar112._24_4_ = 0x3f800000;
      auVar112._28_4_ = 0x3f800000;
    }
    auVar224 = ZEXT3264(auVar112);
    if ((bVar66 & 0x7f) == 0) {
      auVar142._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar142._32_32_ = auVar97;
      auVar261 = ZEXT3264(auVar142._0_32_);
      auVar170 = ZEXT1664(auVar197);
    }
    else {
      fVar244 = *(float *)(ray + k * 4 + 0x200) - (float)local_9f0._0_4_;
      auVar221._4_4_ = fVar244;
      auVar221._0_4_ = fVar244;
      auVar221._8_4_ = fVar244;
      auVar221._12_4_ = fVar244;
      auVar221._16_4_ = fVar244;
      auVar221._20_4_ = fVar244;
      auVar221._24_4_ = fVar244;
      auVar221._28_4_ = fVar244;
      auVar119 = vminps_avx512vl(auVar221,auVar123);
      auVar65._4_4_ = fStack_55c;
      auVar65._0_4_ = local_560;
      auVar65._8_4_ = fStack_558;
      auVar65._12_4_ = fStack_554;
      auVar65._16_4_ = fStack_550;
      auVar65._20_4_ = fStack_54c;
      auVar65._24_4_ = fStack_548;
      auVar65._28_4_ = fStack_544;
      auVar96 = vmaxps_avx512vl(auVar65,auVar122);
      auVar111 = vmulps_avx512vl(auVar45,auVar111);
      auVar110 = vfmadd213ps_avx512vl(auVar110,auVar44,auVar111);
      auVar109 = vfmadd213ps_avx512vl(auVar109,auVar43,auVar110);
      auVar110 = vmulps_avx512vl(local_820,auVar45);
      auVar110 = vfmadd231ps_avx512vl(auVar110,local_800,auVar44);
      auVar110 = vfmadd231ps_avx512vl(auVar110,local_7e0,auVar43);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar261 = ZEXT3264(auVar111);
      vandps_avx512vl(auVar110,auVar111);
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar111,auVar120,1);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar109 = vxorps_avx512vl(auVar109,auVar121);
      auVar124 = vrcp14ps_avx512vl(auVar110);
      auVar125 = vxorps_avx512vl(auVar110,auVar121);
      auVar126 = vfnmadd213ps_avx512vl(auVar124,auVar110,auVar112);
      auVar126 = vfmadd132ps_avx512vl(auVar126,auVar124,auVar124);
      auVar109 = vmulps_avx512vl(auVar126,auVar109);
      uVar16 = vcmpps_avx512vl(auVar110,auVar125,1);
      bVar73 = (byte)uVar14 | (byte)uVar16;
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar127 = vblendmps_avx512vl(auVar109,auVar126);
      auVar128._0_4_ =
           (uint)(bVar73 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar124._0_4_;
      bVar79 = (bool)(bVar73 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar79 * auVar127._4_4_ | (uint)!bVar79 * auVar124._4_4_;
      bVar79 = (bool)(bVar73 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar79 * auVar127._8_4_ | (uint)!bVar79 * auVar124._8_4_;
      bVar79 = (bool)(bVar73 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar79 * auVar127._12_4_ | (uint)!bVar79 * auVar124._12_4_;
      bVar79 = (bool)(bVar73 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar79 * auVar127._16_4_ | (uint)!bVar79 * auVar124._16_4_;
      bVar79 = (bool)(bVar73 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar79 * auVar127._20_4_ | (uint)!bVar79 * auVar124._20_4_;
      bVar79 = (bool)(bVar73 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar79 * auVar127._24_4_ | (uint)!bVar79 * auVar124._24_4_;
      auVar128._28_4_ =
           (uint)(bVar73 >> 7) * auVar127._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar124._28_4_;
      auVar96 = vmaxps_avx(auVar96,auVar128);
      uVar16 = vcmpps_avx512vl(auVar110,auVar125,6);
      bVar73 = (byte)uVar14 | (byte)uVar16;
      auVar259 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar129._0_4_ = (uint)(bVar73 & 1) * 0x7f800000 | (uint)!(bool)(bVar73 & 1) * auVar109._0_4_;
      bVar79 = (bool)(bVar73 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * auVar109._4_4_;
      bVar79 = (bool)(bVar73 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * auVar109._8_4_;
      bVar79 = (bool)(bVar73 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * auVar109._12_4_;
      bVar79 = (bool)(bVar73 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * auVar109._16_4_;
      bVar79 = (bool)(bVar73 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * auVar109._20_4_;
      bVar79 = (bool)(bVar73 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * auVar109._24_4_;
      auVar129._28_4_ =
           (uint)(bVar73 >> 7) * 0x7f800000 | (uint)!(bool)(bVar73 >> 7) * auVar109._28_4_;
      auVar109 = vminps_avx(auVar119,auVar129);
      auVar85 = vxorps_avx512vl(auVar125._0_16_,auVar125._0_16_);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar85),auVar102);
      auVar94 = vsubps_avx512vl(ZEXT1632(auVar85),auVar94);
      auVar110 = ZEXT1632(auVar85);
      auVar95 = vsubps_avx512vl(auVar110,auVar95);
      auVar50._4_4_ = auVar95._4_4_ * auVar107._4_4_;
      auVar50._0_4_ = auVar95._0_4_ * auVar107._0_4_;
      auVar50._8_4_ = auVar95._8_4_ * auVar107._8_4_;
      auVar50._12_4_ = auVar95._12_4_ * auVar107._12_4_;
      auVar50._16_4_ = auVar95._16_4_ * auVar107._16_4_;
      auVar50._20_4_ = auVar95._20_4_ * auVar107._20_4_;
      auVar50._24_4_ = auVar95._24_4_ * auVar107._24_4_;
      auVar50._28_4_ = auVar95._28_4_;
      auVar94 = vfnmsub231ps_avx512vl(auVar50,auVar93,auVar94);
      auVar102 = vfnmadd231ps_avx512vl(auVar94,auVar92,auVar102);
      auVar94 = vmulps_avx512vl(local_820,auVar107);
      auVar94 = vfnmsub231ps_avx512vl(auVar94,local_800,auVar93);
      auVar94 = vfnmadd231ps_avx512vl(auVar94,local_7e0,auVar92);
      vandps_avx512vl(auVar94,auVar111);
      uVar14 = vcmpps_avx512vl(auVar94,auVar120,1);
      auVar102 = vxorps_avx512vl(auVar102,auVar121);
      auVar95 = vrcp14ps_avx512vl(auVar94);
      auVar92 = vxorps_avx512vl(auVar94,auVar121);
      auVar253 = ZEXT3264(auVar92);
      auVar107 = vfnmadd213ps_avx512vl(auVar95,auVar94,auVar112);
      auVar85 = vfmadd132ps_fma(auVar107,auVar95,auVar95);
      auVar257 = ZEXT1664(auVar85);
      fVar244 = auVar85._0_4_ * auVar102._0_4_;
      fVar246 = auVar85._4_4_ * auVar102._4_4_;
      auVar51._4_4_ = fVar246;
      auVar51._0_4_ = fVar244;
      fVar247 = auVar85._8_4_ * auVar102._8_4_;
      auVar51._8_4_ = fVar247;
      fVar248 = auVar85._12_4_ * auVar102._12_4_;
      auVar51._12_4_ = fVar248;
      fVar239 = auVar102._16_4_ * 0.0;
      auVar51._16_4_ = fVar239;
      fVar240 = auVar102._20_4_ * 0.0;
      auVar51._20_4_ = fVar240;
      fVar249 = auVar102._24_4_ * 0.0;
      auVar51._24_4_ = fVar249;
      auVar51._28_4_ = auVar102._28_4_;
      uVar16 = vcmpps_avx512vl(auVar94,auVar92,1);
      bVar73 = (byte)uVar14 | (byte)uVar16;
      auVar107 = vblendmps_avx512vl(auVar51,auVar126);
      auVar130._0_4_ =
           (uint)(bVar73 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar95._0_4_;
      bVar79 = (bool)(bVar73 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar79 * auVar107._4_4_ | (uint)!bVar79 * auVar95._4_4_;
      bVar79 = (bool)(bVar73 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar79 * auVar107._8_4_ | (uint)!bVar79 * auVar95._8_4_;
      bVar79 = (bool)(bVar73 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar79 * auVar107._12_4_ | (uint)!bVar79 * auVar95._12_4_;
      bVar79 = (bool)(bVar73 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar79 * auVar107._16_4_ | (uint)!bVar79 * auVar95._16_4_;
      bVar79 = (bool)(bVar73 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar79 * auVar107._20_4_ | (uint)!bVar79 * auVar95._20_4_;
      bVar79 = (bool)(bVar73 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar79 * auVar107._24_4_ | (uint)!bVar79 * auVar95._24_4_;
      auVar130._28_4_ =
           (uint)(bVar73 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar95._28_4_;
      auVar251 = ZEXT3264(auVar130);
      _local_980 = vmaxps_avx(auVar96,auVar130);
      uVar16 = vcmpps_avx512vl(auVar94,auVar92,6);
      bVar73 = (byte)uVar14 | (byte)uVar16;
      auVar131._0_4_ = (uint)(bVar73 & 1) * 0x7f800000 | (uint)!(bool)(bVar73 & 1) * (int)fVar244;
      bVar79 = (bool)(bVar73 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar246;
      bVar79 = (bool)(bVar73 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar247;
      bVar79 = (bool)(bVar73 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar248;
      bVar79 = (bool)(bVar73 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar239;
      bVar79 = (bool)(bVar73 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar240;
      bVar79 = (bool)(bVar73 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar249;
      auVar131._28_4_ =
           (uint)(bVar73 >> 7) * 0x7f800000 | (uint)!(bool)(bVar73 >> 7) * auVar102._28_4_;
      auVar245 = ZEXT3264(auVar131);
      local_7a0 = vminps_avx(auVar109,auVar131);
      auVar243 = ZEXT3264(local_7a0);
      uVar14 = vcmpps_avx512vl(_local_980,local_7a0,2);
      bVar66 = bVar66 & 0x7f & (byte)uVar14;
      if (bVar66 == 0) {
        auVar142._32_32_ = auVar97;
        auVar142._0_32_ = auVar112;
        auVar224 = ZEXT3264(auVar112);
        auVar170 = ZEXT1664(auVar197);
      }
      else {
        auVar102 = vmaxps_avx512vl(auVar110,auVar106);
        auVar96 = vminps_avx512vl(local_880,auVar112);
        auVar58 = ZEXT412(0);
        auVar251 = ZEXT1264(auVar58) << 0x20;
        auVar96 = vmaxps_avx(auVar96,ZEXT1232(auVar58) << 0x20);
        auVar94 = vminps_avx512vl(local_8a0,auVar112);
        auVar257 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar52._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
        auVar52._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
        auVar52._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
        auVar52._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
        auVar52._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
        auVar52._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
        auVar52._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
        auVar52._28_4_ = auVar96._28_4_ + 7.0;
        auVar259 = ZEXT3264(local_ac0);
        auVar85 = vfmadd213ps_fma(auVar52,local_ac0,auVar230);
        local_880 = ZEXT1632(auVar85);
        auVar96 = vmaxps_avx(auVar94,ZEXT1232(auVar58) << 0x20);
        auVar53._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
        auVar53._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
        auVar53._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
        auVar53._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
        auVar53._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
        auVar53._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
        auVar53._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
        auVar53._28_4_ = auVar96._28_4_ + 7.0;
        auVar85 = vfmadd213ps_fma(auVar53,local_ac0,auVar230);
        local_8a0 = ZEXT1632(auVar85);
        auVar222._0_4_ = auVar102._0_4_ * auVar102._0_4_;
        auVar222._4_4_ = auVar102._4_4_ * auVar102._4_4_;
        auVar222._8_4_ = auVar102._8_4_ * auVar102._8_4_;
        auVar222._12_4_ = auVar102._12_4_ * auVar102._12_4_;
        auVar222._16_4_ = auVar102._16_4_ * auVar102._16_4_;
        auVar222._20_4_ = auVar102._20_4_ * auVar102._20_4_;
        auVar222._24_4_ = auVar102._24_4_ * auVar102._24_4_;
        auVar222._28_4_ = 0;
        auVar96 = vsubps_avx(local_ae0,auVar222);
        auVar253 = ZEXT3264(auVar96);
        auVar102 = vmulps_avx512vl(auVar118,auVar96);
        auVar102 = vsubps_avx512vl(auVar114,auVar102);
        uVar14 = vcmpps_avx512vl(auVar102,ZEXT1232(auVar58) << 0x20,5);
        bVar73 = (byte)uVar14;
        if (bVar73 == 0) {
          auVar98 = ZEXT832(0) << 0x20;
          auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar102 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar94 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar245 = ZEXT864(0) << 0x20;
          auVar132._8_4_ = 0x7f800000;
          auVar132._0_8_ = 0x7f8000007f800000;
          auVar132._12_4_ = 0x7f800000;
          auVar132._16_4_ = 0x7f800000;
          auVar132._20_4_ = 0x7f800000;
          auVar132._24_4_ = 0x7f800000;
          auVar132._28_4_ = 0x7f800000;
          auVar133._8_4_ = 0xff800000;
          auVar133._0_8_ = 0xff800000ff800000;
          auVar133._12_4_ = 0xff800000;
          auVar133._16_4_ = 0xff800000;
          auVar133._20_4_ = 0xff800000;
          auVar133._24_4_ = 0xff800000;
          auVar133._28_4_ = 0xff800000;
        }
        else {
          auVar83 = vxorps_avx512vl(auVar93._0_16_,auVar93._0_16_);
          uVar81 = vcmpps_avx512vl(auVar102,auVar110,5);
          auVar102 = vsqrtps_avx(auVar102);
          auVar233._0_4_ = auVar117._0_4_ + auVar117._0_4_;
          auVar233._4_4_ = auVar117._4_4_ + auVar117._4_4_;
          auVar233._8_4_ = auVar117._8_4_ + auVar117._8_4_;
          auVar233._12_4_ = auVar117._12_4_ + auVar117._12_4_;
          auVar233._16_4_ = auVar117._16_4_ + auVar117._16_4_;
          auVar233._20_4_ = auVar117._20_4_ + auVar117._20_4_;
          auVar233._24_4_ = auVar117._24_4_ + auVar117._24_4_;
          auVar233._28_4_ = auVar117._28_4_ + auVar117._28_4_;
          auVar94 = vrcp14ps_avx512vl(auVar233);
          auVar95 = vfnmadd213ps_avx512vl(auVar233,auVar94,auVar112);
          auVar85 = vfmadd132ps_fma(auVar95,auVar94,auVar94);
          auVar22._8_4_ = 0x80000000;
          auVar22._0_8_ = 0x8000000080000000;
          auVar22._12_4_ = 0x80000000;
          auVar22._16_4_ = 0x80000000;
          auVar22._20_4_ = 0x80000000;
          auVar22._24_4_ = 0x80000000;
          auVar22._28_4_ = 0x80000000;
          auVar94 = vxorps_avx512vl(auVar113,auVar22);
          auVar94 = vsubps_avx(auVar94,auVar102);
          auVar54._4_4_ = auVar94._4_4_ * auVar85._4_4_;
          auVar54._0_4_ = auVar94._0_4_ * auVar85._0_4_;
          auVar54._8_4_ = auVar94._8_4_ * auVar85._8_4_;
          auVar54._12_4_ = auVar94._12_4_ * auVar85._12_4_;
          auVar54._16_4_ = auVar94._16_4_ * 0.0;
          auVar54._20_4_ = auVar94._20_4_ * 0.0;
          auVar54._24_4_ = auVar94._24_4_ * 0.0;
          auVar54._28_4_ = 0x3e000000;
          auVar257 = ZEXT3264(auVar54);
          auVar102 = vsubps_avx512vl(auVar102,auVar113);
          auVar55._4_4_ = auVar102._4_4_ * auVar85._4_4_;
          auVar55._0_4_ = auVar102._0_4_ * auVar85._0_4_;
          auVar55._8_4_ = auVar102._8_4_ * auVar85._8_4_;
          auVar55._12_4_ = auVar102._12_4_ * auVar85._12_4_;
          auVar55._16_4_ = auVar102._16_4_ * 0.0;
          auVar55._20_4_ = auVar102._20_4_ * 0.0;
          auVar55._24_4_ = auVar102._24_4_ * 0.0;
          auVar55._28_4_ = fVar196;
          auVar259 = ZEXT3264(auVar55);
          auVar102 = vfmadd213ps_avx512vl(auVar115,auVar54,auVar108);
          auVar56._4_4_ = auVar98._4_4_ * auVar102._4_4_;
          auVar56._0_4_ = auVar98._0_4_ * auVar102._0_4_;
          auVar56._8_4_ = auVar98._8_4_ * auVar102._8_4_;
          auVar56._12_4_ = auVar98._12_4_ * auVar102._12_4_;
          auVar56._16_4_ = auVar98._16_4_ * auVar102._16_4_;
          auVar56._20_4_ = auVar98._20_4_ * auVar102._20_4_;
          auVar56._24_4_ = auVar98._24_4_ * auVar102._24_4_;
          auVar56._28_4_ = auVar94._28_4_;
          auVar102 = vmulps_avx512vl(local_7e0,auVar54);
          auVar94 = vmulps_avx512vl(local_800,auVar54);
          auVar95 = vmulps_avx512vl(local_820,auVar54);
          auVar106 = vfmadd213ps_avx512vl(auVar99,auVar56,auVar103);
          auVar102 = vsubps_avx512vl(auVar102,auVar106);
          auVar106 = vfmadd213ps_avx512vl(auVar100,auVar56,auVar104);
          auVar94 = vsubps_avx512vl(auVar94,auVar106);
          auVar85 = vfmadd213ps_fma(auVar56,auVar101,auVar105);
          auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar85));
          auVar245 = ZEXT3264(auVar95);
          auVar95 = vfmadd213ps_avx512vl(auVar115,auVar55,auVar108);
          auVar95 = vmulps_avx512vl(auVar98,auVar95);
          auVar98 = vmulps_avx512vl(local_7e0,auVar55);
          auVar106 = vmulps_avx512vl(local_800,auVar55);
          auVar92 = vmulps_avx512vl(local_820,auVar55);
          auVar85 = vfmadd213ps_fma(auVar99,auVar95,auVar103);
          auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar85));
          auVar251 = ZEXT3264(auVar98);
          auVar85 = vfmadd213ps_fma(auVar100,auVar95,auVar104);
          auVar98 = vsubps_avx512vl(auVar106,ZEXT1632(auVar85));
          auVar85 = vfmadd213ps_fma(auVar101,auVar95,auVar105);
          auVar99 = vsubps_avx512vl(auVar92,ZEXT1632(auVar85));
          auVar161._8_4_ = 0x7f800000;
          auVar161._0_8_ = 0x7f8000007f800000;
          auVar161._12_4_ = 0x7f800000;
          auVar161._16_4_ = 0x7f800000;
          auVar161._20_4_ = 0x7f800000;
          auVar161._24_4_ = 0x7f800000;
          auVar161._28_4_ = 0x7f800000;
          auVar100 = vblendmps_avx512vl(auVar161,auVar54);
          bVar79 = (bool)((byte)uVar81 & 1);
          auVar132._0_4_ = (uint)bVar79 * auVar100._0_4_ | (uint)!bVar79 * auVar103._0_4_;
          bVar79 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar79 * auVar100._4_4_ | (uint)!bVar79 * auVar103._4_4_;
          bVar79 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar79 * auVar100._8_4_ | (uint)!bVar79 * auVar103._8_4_;
          bVar79 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar132._12_4_ = (uint)bVar79 * auVar100._12_4_ | (uint)!bVar79 * auVar103._12_4_;
          bVar79 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar132._16_4_ = (uint)bVar79 * auVar100._16_4_ | (uint)!bVar79 * auVar103._16_4_;
          bVar79 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar132._20_4_ = (uint)bVar79 * auVar100._20_4_ | (uint)!bVar79 * auVar103._20_4_;
          bVar79 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar132._24_4_ = (uint)bVar79 * auVar100._24_4_ | (uint)!bVar79 * auVar103._24_4_;
          bVar79 = SUB81(uVar81 >> 7,0);
          auVar132._28_4_ = (uint)bVar79 * auVar100._28_4_ | (uint)!bVar79 * auVar103._28_4_;
          auVar162._8_4_ = 0xff800000;
          auVar162._0_8_ = 0xff800000ff800000;
          auVar162._12_4_ = 0xff800000;
          auVar162._16_4_ = 0xff800000;
          auVar162._20_4_ = 0xff800000;
          auVar162._24_4_ = 0xff800000;
          auVar162._28_4_ = 0xff800000;
          auVar100 = vblendmps_avx512vl(auVar162,auVar55);
          bVar79 = (bool)((byte)uVar81 & 1);
          auVar133._0_4_ = (uint)bVar79 * auVar100._0_4_ | (uint)!bVar79 * -0x800000;
          bVar79 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar79 * auVar100._4_4_ | (uint)!bVar79 * -0x800000;
          bVar79 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar79 * auVar100._8_4_ | (uint)!bVar79 * -0x800000;
          bVar79 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar133._12_4_ = (uint)bVar79 * auVar100._12_4_ | (uint)!bVar79 * -0x800000;
          bVar79 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar133._16_4_ = (uint)bVar79 * auVar100._16_4_ | (uint)!bVar79 * -0x800000;
          bVar79 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar133._20_4_ = (uint)bVar79 * auVar100._20_4_ | (uint)!bVar79 * -0x800000;
          bVar79 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar133._24_4_ = (uint)bVar79 * auVar100._24_4_ | (uint)!bVar79 * -0x800000;
          bVar79 = SUB81(uVar81 >> 7,0);
          auVar133._28_4_ = (uint)bVar79 * auVar100._28_4_ | (uint)!bVar79 * -0x800000;
          vandps_avx512vl(auVar111,auVar116);
          auVar100 = vmaxps_avx(local_840,auVar133);
          auVar23._8_4_ = 0x36000000;
          auVar23._0_8_ = 0x3600000036000000;
          auVar23._12_4_ = 0x36000000;
          auVar23._16_4_ = 0x36000000;
          auVar23._20_4_ = 0x36000000;
          auVar23._24_4_ = 0x36000000;
          auVar23._28_4_ = 0x36000000;
          auVar100 = vmulps_avx512vl(auVar100,auVar23);
          vandps_avx512vl(auVar117,auVar111);
          uVar71 = vcmpps_avx512vl(auVar100,auVar100,1);
          uVar81 = uVar81 & uVar71;
          bVar68 = (byte)uVar81;
          if (bVar68 != 0) {
            uVar71 = vcmpps_avx512vl(auVar96,ZEXT1632(auVar83),2);
            auVar242._8_4_ = 0xff800000;
            auVar242._0_8_ = 0xff800000ff800000;
            auVar242._12_4_ = 0xff800000;
            auVar242._16_4_ = 0xff800000;
            auVar242._20_4_ = 0xff800000;
            auVar242._24_4_ = 0xff800000;
            auVar242._28_4_ = 0xff800000;
            auVar252._8_4_ = 0x7f800000;
            auVar252._0_8_ = 0x7f8000007f800000;
            auVar252._12_4_ = 0x7f800000;
            auVar252._16_4_ = 0x7f800000;
            auVar252._20_4_ = 0x7f800000;
            auVar252._24_4_ = 0x7f800000;
            auVar252._28_4_ = 0x7f800000;
            auVar253 = ZEXT3264(auVar252);
            auVar96 = vblendmps_avx512vl(auVar252,auVar242);
            bVar72 = (byte)uVar71;
            uVar82 = (uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar100._0_4_
            ;
            bVar79 = (bool)((byte)(uVar71 >> 1) & 1);
            uVar143 = (uint)bVar79 * auVar96._4_4_ | (uint)!bVar79 * auVar100._4_4_;
            bVar79 = (bool)((byte)(uVar71 >> 2) & 1);
            uVar144 = (uint)bVar79 * auVar96._8_4_ | (uint)!bVar79 * auVar100._8_4_;
            bVar79 = (bool)((byte)(uVar71 >> 3) & 1);
            uVar145 = (uint)bVar79 * auVar96._12_4_ | (uint)!bVar79 * auVar100._12_4_;
            bVar79 = (bool)((byte)(uVar71 >> 4) & 1);
            uVar146 = (uint)bVar79 * auVar96._16_4_ | (uint)!bVar79 * auVar100._16_4_;
            bVar79 = (bool)((byte)(uVar71 >> 5) & 1);
            uVar147 = (uint)bVar79 * auVar96._20_4_ | (uint)!bVar79 * auVar100._20_4_;
            bVar79 = (bool)((byte)(uVar71 >> 6) & 1);
            uVar148 = (uint)bVar79 * auVar96._24_4_ | (uint)!bVar79 * auVar100._24_4_;
            bVar79 = SUB81(uVar71 >> 7,0);
            uVar149 = (uint)bVar79 * auVar96._28_4_ | (uint)!bVar79 * auVar100._28_4_;
            auVar132._0_4_ = (bVar68 & 1) * uVar82 | !(bool)(bVar68 & 1) * auVar132._0_4_;
            bVar79 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar132._4_4_ = bVar79 * uVar143 | !bVar79 * auVar132._4_4_;
            bVar79 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar132._8_4_ = bVar79 * uVar144 | !bVar79 * auVar132._8_4_;
            bVar79 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar132._12_4_ = bVar79 * uVar145 | !bVar79 * auVar132._12_4_;
            bVar79 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar132._16_4_ = bVar79 * uVar146 | !bVar79 * auVar132._16_4_;
            bVar79 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar132._20_4_ = bVar79 * uVar147 | !bVar79 * auVar132._20_4_;
            bVar79 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar132._24_4_ = bVar79 * uVar148 | !bVar79 * auVar132._24_4_;
            bVar79 = SUB81(uVar81 >> 7,0);
            auVar132._28_4_ = bVar79 * uVar149 | !bVar79 * auVar132._28_4_;
            auVar96 = vblendmps_avx512vl(auVar242,auVar252);
            bVar79 = (bool)((byte)(uVar71 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar71 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar71 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar71 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar71 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar71 >> 6) & 1);
            bVar11 = SUB81(uVar71 >> 7,0);
            auVar133._0_4_ =
                 (uint)(bVar68 & 1) *
                 ((uint)(bVar72 & 1) * auVar96._0_4_ | !(bool)(bVar72 & 1) * uVar82) |
                 !(bool)(bVar68 & 1) * auVar133._0_4_;
            bVar5 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar133._4_4_ =
                 (uint)bVar5 * ((uint)bVar79 * auVar96._4_4_ | !bVar79 * uVar143) |
                 !bVar5 * auVar133._4_4_;
            bVar79 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar133._8_4_ =
                 (uint)bVar79 * ((uint)bVar6 * auVar96._8_4_ | !bVar6 * uVar144) |
                 !bVar79 * auVar133._8_4_;
            bVar79 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar133._12_4_ =
                 (uint)bVar79 * ((uint)bVar7 * auVar96._12_4_ | !bVar7 * uVar145) |
                 !bVar79 * auVar133._12_4_;
            bVar79 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar133._16_4_ =
                 (uint)bVar79 * ((uint)bVar8 * auVar96._16_4_ | !bVar8 * uVar146) |
                 !bVar79 * auVar133._16_4_;
            bVar79 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar133._20_4_ =
                 (uint)bVar79 * ((uint)bVar9 * auVar96._20_4_ | !bVar9 * uVar147) |
                 !bVar79 * auVar133._20_4_;
            bVar79 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar133._24_4_ =
                 (uint)bVar79 * ((uint)bVar10 * auVar96._24_4_ | !bVar10 * uVar148) |
                 !bVar79 * auVar133._24_4_;
            bVar79 = SUB81(uVar81 >> 7,0);
            auVar133._28_4_ =
                 (uint)bVar79 * ((uint)bVar11 * auVar96._28_4_ | !bVar11 * uVar149) |
                 !bVar79 * auVar133._28_4_;
            bVar73 = (~bVar68 | bVar72) & bVar73;
          }
        }
        auVar96 = vmulps_avx512vl(local_820,auVar99);
        auVar96 = vfmadd231ps_avx512vl(auVar96,local_800,auVar98);
        auVar142._0_32_ = vfmadd231ps_avx512vl(auVar96,local_7e0,auVar251._0_32_);
        auVar142._32_32_ = auVar97;
        _local_500 = _local_980;
        local_4e0 = vminps_avx(local_7a0,auVar132);
        vandps_avx512vl(auVar142._0_32_,auVar111);
        _local_8e0 = vmaxps_avx(_local_980,auVar133);
        auVar237 = ZEXT3264(_local_8e0);
        _local_7c0 = _local_8e0;
        auVar163._8_4_ = 0x3e99999a;
        auVar163._0_8_ = 0x3e99999a3e99999a;
        auVar163._12_4_ = 0x3e99999a;
        auVar163._16_4_ = 0x3e99999a;
        auVar163._20_4_ = 0x3e99999a;
        auVar163._24_4_ = 0x3e99999a;
        auVar163._28_4_ = 0x3e99999a;
        uVar14 = vcmpps_avx512vl(auVar142._0_32_,auVar163,1);
        uVar16 = vcmpps_avx512vl(_local_980,local_4e0,2);
        bVar68 = (byte)uVar16 & bVar66;
        uVar15 = vcmpps_avx512vl(_local_8e0,local_7a0,2);
        if ((bVar66 & ((byte)uVar15 | (byte)uVar16)) == 0) {
          auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar170 = ZEXT1664(auVar197);
        }
        else {
          auVar96 = vmulps_avx512vl(local_820,auVar245._0_32_);
          auVar96 = vfmadd213ps_avx512vl(auVar94,local_800,auVar96);
          auVar96 = vfmadd213ps_avx512vl(auVar102,local_7e0,auVar96);
          vandps_avx512vl(auVar96,auVar111);
          uVar16 = vcmpps_avx512vl(auVar96,auVar163,1);
          bVar72 = (byte)uVar16 | ~bVar73;
          auVar164._8_4_ = 2;
          auVar164._0_8_ = 0x200000002;
          auVar164._12_4_ = 2;
          auVar164._16_4_ = 2;
          auVar164._20_4_ = 2;
          auVar164._24_4_ = 2;
          auVar164._28_4_ = 2;
          auVar24._8_4_ = 3;
          auVar24._0_8_ = 0x300000003;
          auVar24._12_4_ = 3;
          auVar24._16_4_ = 3;
          auVar24._20_4_ = 3;
          auVar24._24_4_ = 3;
          auVar24._28_4_ = 3;
          auVar96 = vpblendmd_avx512vl(auVar164,auVar24);
          local_780._0_4_ = (uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * 2;
          bVar79 = (bool)(bVar72 >> 1 & 1);
          local_780._4_4_ = (uint)bVar79 * auVar96._4_4_ | (uint)!bVar79 * 2;
          bVar79 = (bool)(bVar72 >> 2 & 1);
          local_780._8_4_ = (uint)bVar79 * auVar96._8_4_ | (uint)!bVar79 * 2;
          bVar79 = (bool)(bVar72 >> 3 & 1);
          local_780._12_4_ = (uint)bVar79 * auVar96._12_4_ | (uint)!bVar79 * 2;
          bVar79 = (bool)(bVar72 >> 4 & 1);
          local_780._16_4_ = (uint)bVar79 * auVar96._16_4_ | (uint)!bVar79 * 2;
          bVar79 = (bool)(bVar72 >> 5 & 1);
          local_780._20_4_ = (uint)bVar79 * auVar96._20_4_ | (uint)!bVar79 * 2;
          bVar79 = (bool)(bVar72 >> 6 & 1);
          local_780._24_4_ = (uint)bVar79 * auVar96._24_4_ | (uint)!bVar79 * 2;
          local_780._28_4_ = (uint)(bVar72 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar72 >> 7) * 2;
          auVar170._0_32_ = vpbroadcastd_avx512vl();
          auVar170._32_32_ = auVar97;
          local_860 = auVar170._0_32_;
          uVar16 = vpcmpd_avx512vl(auVar170._0_32_,local_780,5);
          bVar72 = (byte)uVar16 & bVar68;
          if (bVar72 == 0) {
            auVar227._8_4_ = 0x7fffffff;
            auVar227._0_8_ = 0x7fffffff7fffffff;
            auVar227._12_4_ = 0x7fffffff;
          }
          else {
            auVar83 = vminps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar85 = vmaxps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar1 = vminps_avx(local_a40._0_16_,local_a80._0_16_);
            auVar86 = vminps_avx(auVar83,auVar1);
            auVar83 = vmaxps_avx(local_a40._0_16_,local_a80._0_16_);
            auVar1 = vmaxps_avx(auVar85,auVar83);
            auVar198._8_4_ = 0x7fffffff;
            auVar198._0_8_ = 0x7fffffff7fffffff;
            auVar198._12_4_ = 0x7fffffff;
            auVar85 = vandps_avx(auVar86,auVar198);
            auVar83 = vandps_avx(auVar1,auVar198);
            auVar85 = vmaxps_avx(auVar85,auVar83);
            auVar83 = vmovshdup_avx(auVar85);
            auVar83 = vmaxss_avx(auVar83,auVar85);
            auVar85 = vshufpd_avx(auVar85,auVar85,1);
            auVar85 = vmaxss_avx(auVar85,auVar83);
            fVar244 = auVar85._0_4_ * 1.9073486e-06;
            local_a00 = vshufps_avx(auVar1,auVar1,0xff);
            local_8c0 = (float)local_980._0_4_ + (float)local_960._0_4_;
            fStack_8bc = (float)local_980._4_4_ + (float)local_960._4_4_;
            fStack_8b8 = fStack_978 + fStack_958;
            fStack_8b4 = fStack_974 + fStack_954;
            fStack_8b0 = fStack_970 + fStack_950;
            fStack_8ac = fStack_96c + fStack_94c;
            fStack_8a8 = fStack_968 + fStack_948;
            fStack_8a4 = fStack_964 + fStack_944;
            do {
              auVar165._8_4_ = 0x7f800000;
              auVar165._0_8_ = 0x7f8000007f800000;
              auVar165._12_4_ = 0x7f800000;
              auVar165._16_4_ = 0x7f800000;
              auVar165._20_4_ = 0x7f800000;
              auVar165._24_4_ = 0x7f800000;
              auVar165._28_4_ = 0x7f800000;
              auVar97 = vblendmps_avx512vl(auVar165,_local_980);
              auVar134._0_4_ =
                   (uint)(bVar72 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar72 & 1) * 0x7f800000;
              bVar79 = (bool)(bVar72 >> 1 & 1);
              auVar134._4_4_ = (uint)bVar79 * auVar97._4_4_ | (uint)!bVar79 * 0x7f800000;
              bVar79 = (bool)(bVar72 >> 2 & 1);
              auVar134._8_4_ = (uint)bVar79 * auVar97._8_4_ | (uint)!bVar79 * 0x7f800000;
              bVar79 = (bool)(bVar72 >> 3 & 1);
              auVar134._12_4_ = (uint)bVar79 * auVar97._12_4_ | (uint)!bVar79 * 0x7f800000;
              bVar79 = (bool)(bVar72 >> 4 & 1);
              auVar134._16_4_ = (uint)bVar79 * auVar97._16_4_ | (uint)!bVar79 * 0x7f800000;
              bVar79 = (bool)(bVar72 >> 5 & 1);
              auVar134._20_4_ = (uint)bVar79 * auVar97._20_4_ | (uint)!bVar79 * 0x7f800000;
              auVar134._24_4_ =
                   (uint)(bVar72 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar72 >> 6) * 0x7f800000;
              auVar134._28_4_ = 0x7f800000;
              auVar170._0_32_ = auVar134;
              auVar97 = vshufps_avx(auVar134,auVar134,0xb1);
              auVar97 = vminps_avx(auVar134,auVar97);
              auVar96 = vshufpd_avx(auVar97,auVar97,5);
              auVar97 = vminps_avx(auVar97,auVar96);
              auVar96 = vpermpd_avx2(auVar97,0x4e);
              auVar97 = vminps_avx(auVar97,auVar96);
              uVar16 = vcmpps_avx512vl(auVar134,auVar97,0);
              bVar67 = (byte)uVar16 & bVar72;
              bVar74 = bVar72;
              if (bVar67 != 0) {
                bVar74 = bVar67;
              }
              iVar17 = 0;
              for (uVar82 = (uint)bVar74; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              bVar74 = '\x01' << ((byte)iVar17 & 0x1f);
              uVar82 = *(uint *)(local_880 + (uint)(iVar17 << 2));
              uVar143 = *(uint *)(local_500 + (uint)(iVar17 << 2));
              fVar246 = auVar13._0_4_;
              if ((float)local_aa0._0_4_ < 0.0) {
                fVar246 = sqrtf((float)local_aa0._0_4_);
              }
              auVar251 = ZEXT464(uVar82);
              auVar243 = ZEXT464(uVar143);
              bVar67 = ~bVar74;
              lVar78 = 5;
              do {
                auVar97 = auVar170._32_32_;
                fVar247 = auVar243._0_4_;
                auVar153._4_4_ = fVar247;
                auVar153._0_4_ = fVar247;
                auVar153._8_4_ = fVar247;
                auVar153._12_4_ = fVar247;
                auVar85 = vfmadd132ps_fma(auVar153,ZEXT816(0) << 0x40,local_a90);
                fVar250 = auVar251._0_4_;
                fVar235 = 1.0 - fVar250;
                fVar239 = fVar235 * fVar235 * fVar235;
                fVar215 = fVar250 * fVar250 * fVar250;
                auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar239),
                                          ZEXT416((uint)fVar215));
                fVar248 = fVar250 * fVar235;
                auVar225 = ZEXT416((uint)fVar235);
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar248 * 6.0)),
                                          ZEXT416((uint)(fVar248 * fVar235)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar215),
                                         ZEXT416((uint)fVar239));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * fVar235 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar250 * fVar248)));
                fVar239 = fVar239 * 0.16666667;
                fVar240 = (auVar83._0_4_ + auVar86._0_4_) * 0.16666667;
                fVar249 = (auVar1._0_4_ + auVar84._0_4_) * 0.16666667;
                fVar215 = fVar215 * 0.16666667;
                auVar199._0_4_ = fVar215 * (float)local_a80._0_4_;
                auVar199._4_4_ = fVar215 * (float)local_a80._4_4_;
                auVar199._8_4_ = fVar215 * fStack_a78;
                auVar199._12_4_ = fVar215 * fStack_a74;
                auVar226._4_4_ = fVar249;
                auVar226._0_4_ = fVar249;
                auVar226._8_4_ = fVar249;
                auVar226._12_4_ = fVar249;
                auVar83 = vfmadd132ps_fma(auVar226,auVar199,local_a40._0_16_);
                auVar200._4_4_ = fVar240;
                auVar200._0_4_ = fVar240;
                auVar200._8_4_ = fVar240;
                auVar200._12_4_ = fVar240;
                auVar83 = vfmadd132ps_fma(auVar200,auVar83,local_a60._0_16_);
                auVar177._4_4_ = fVar239;
                auVar177._0_4_ = fVar239;
                auVar177._8_4_ = fVar239;
                auVar177._12_4_ = fVar239;
                local_990 = vfmadd132ps_fma(auVar177,auVar83,local_a20._0_16_);
                auVar85 = vsubps_avx(auVar85,local_990);
                local_ac0._0_16_ = auVar85;
                auVar85 = vdpps_avx(auVar85,auVar85,0x7f);
                auVar83 = auVar251._0_16_;
                local_ae0._0_16_ = auVar85;
                if (auVar85._0_4_ < 0.0) {
                  auVar237._0_4_ = sqrtf(auVar85._0_4_);
                  auVar237._4_60_ = extraout_var;
                  auVar85 = auVar237._0_16_;
                }
                else {
                  auVar85 = vsqrtss_avx(auVar85,auVar85);
                }
                auVar86 = vfnmsub213ss_fma(auVar83,auVar83,ZEXT416((uint)(fVar248 * 4.0)));
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * 4.0)),auVar225,auVar225);
                fVar248 = fVar235 * -fVar235 * 0.5;
                fVar239 = auVar86._0_4_ * 0.5;
                fVar240 = auVar1._0_4_ * 0.5;
                fVar249 = fVar250 * fVar250 * 0.5;
                auVar216._0_4_ = fVar249 * (float)local_a80._0_4_;
                auVar216._4_4_ = fVar249 * (float)local_a80._4_4_;
                auVar216._8_4_ = fVar249 * fStack_a78;
                auVar216._12_4_ = fVar249 * fStack_a74;
                auVar178._4_4_ = fVar240;
                auVar178._0_4_ = fVar240;
                auVar178._8_4_ = fVar240;
                auVar178._12_4_ = fVar240;
                auVar1 = vfmadd132ps_fma(auVar178,auVar216,local_a40._0_16_);
                auVar201._4_4_ = fVar239;
                auVar201._0_4_ = fVar239;
                auVar201._8_4_ = fVar239;
                auVar201._12_4_ = fVar239;
                auVar1 = vfmadd132ps_fma(auVar201,auVar1,local_a60._0_16_);
                auVar255._4_4_ = fVar248;
                auVar255._0_4_ = fVar248;
                auVar255._8_4_ = fVar248;
                auVar255._12_4_ = fVar248;
                auVar1 = vfmadd132ps_fma(auVar255,auVar1,local_a20._0_16_);
                local_9b0 = vdpps_avx(auVar1,auVar1,0x7f);
                auVar59._12_4_ = 0;
                auVar59._0_12_ = ZEXT812(0);
                fVar248 = local_9b0._0_4_;
                auVar86 = vrsqrt14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar248));
                fVar239 = auVar86._0_4_;
                local_9c0 = vrcp14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar248));
                auVar86 = vfnmadd213ss_fma(local_9c0,local_9b0,ZEXT416(0x40000000));
                uVar82 = auVar85._0_4_;
                local_9a0 = fVar235;
                fStack_99c = fVar235;
                fStack_998 = fVar235;
                fStack_994 = fVar235;
                if (fVar248 < -fVar248) {
                  fVar240 = sqrtf(fVar248);
                  auVar85 = ZEXT416(uVar82);
                }
                else {
                  auVar84 = vsqrtss_avx(local_9b0,local_9b0);
                  fVar240 = auVar84._0_4_;
                }
                fVar248 = fVar239 * 1.5 + fVar248 * -0.5 * fVar239 * fVar239 * fVar239;
                auVar154._0_4_ = auVar1._0_4_ * fVar248;
                auVar154._4_4_ = auVar1._4_4_ * fVar248;
                auVar154._8_4_ = auVar1._8_4_ * fVar248;
                auVar154._12_4_ = auVar1._12_4_ * fVar248;
                auVar84 = vdpps_avx(local_ac0._0_16_,auVar154,0x7f);
                fVar215 = auVar85._0_4_;
                fVar239 = auVar84._0_4_;
                auVar155._0_4_ = fVar239 * fVar239;
                auVar155._4_4_ = auVar84._4_4_ * auVar84._4_4_;
                auVar155._8_4_ = auVar84._8_4_ * auVar84._8_4_;
                auVar155._12_4_ = auVar84._12_4_ * auVar84._12_4_;
                auVar87 = vsubps_avx512vl(local_ae0._0_16_,auVar155);
                fVar249 = auVar87._0_4_;
                auVar179._4_12_ = ZEXT812(0) << 0x20;
                auVar179._0_4_ = fVar249;
                auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar179);
                auVar89 = vmulss_avx512f(auVar88,ZEXT416(0x3fc00000));
                auVar90 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
                if (fVar249 < 0.0) {
                  local_9e0 = fVar248;
                  fStack_9dc = fVar248;
                  fStack_9d8 = fVar248;
                  fStack_9d4 = fVar248;
                  local_9d0 = auVar88;
                  fVar249 = sqrtf(fVar249);
                  auVar90 = ZEXT416(auVar90._0_4_);
                  auVar89 = ZEXT416(auVar89._0_4_);
                  auVar85 = ZEXT416(uVar82);
                  auVar88 = local_9d0;
                  fVar248 = local_9e0;
                  fVar235 = fStack_9dc;
                  fVar236 = fStack_9d8;
                  fVar241 = fStack_9d4;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                  fVar249 = auVar87._0_4_;
                  fVar235 = fVar248;
                  fVar236 = fVar248;
                  fVar241 = fVar248;
                }
                auVar257 = ZEXT1664(auVar1);
                auVar245 = ZEXT1664(local_ac0._0_16_);
                auVar243._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar243._32_32_ = auVar97;
                auVar261 = ZEXT3264(auVar243._0_32_);
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar225,auVar83);
                auVar83 = vfmadd231ss_fma(auVar225,auVar83,SUB6416(ZEXT464(0xc0000000),0));
                auVar202._0_4_ = fVar250 * (float)local_a80._0_4_;
                auVar202._4_4_ = fVar250 * (float)local_a80._4_4_;
                auVar202._8_4_ = fVar250 * fStack_a78;
                auVar202._12_4_ = fVar250 * fStack_a74;
                auVar217._0_4_ = auVar83._0_4_;
                auVar217._4_4_ = auVar217._0_4_;
                auVar217._8_4_ = auVar217._0_4_;
                auVar217._12_4_ = auVar217._0_4_;
                auVar83 = vfmadd132ps_fma(auVar217,auVar202,local_a40._0_16_);
                auVar180._0_4_ = auVar87._0_4_;
                auVar180._4_4_ = auVar180._0_4_;
                auVar180._8_4_ = auVar180._0_4_;
                auVar180._12_4_ = auVar180._0_4_;
                auVar83 = vfmadd132ps_fma(auVar180,auVar83,local_a60._0_16_);
                auVar61._4_4_ = fStack_99c;
                auVar61._0_4_ = local_9a0;
                auVar61._8_4_ = fStack_998;
                auVar61._12_4_ = fStack_994;
                auVar83 = vfmadd132ps_fma(auVar61,auVar83,local_a20._0_16_);
                auVar181._0_4_ = auVar83._0_4_ * (float)local_9b0._0_4_;
                auVar181._4_4_ = auVar83._4_4_ * (float)local_9b0._0_4_;
                auVar181._8_4_ = auVar83._8_4_ * (float)local_9b0._0_4_;
                auVar181._12_4_ = auVar83._12_4_ * (float)local_9b0._0_4_;
                auVar83 = vdpps_avx(auVar1,auVar83,0x7f);
                fVar196 = auVar83._0_4_;
                auVar203._0_4_ = auVar1._0_4_ * fVar196;
                auVar203._4_4_ = auVar1._4_4_ * fVar196;
                auVar203._8_4_ = auVar1._8_4_ * fVar196;
                auVar203._12_4_ = auVar1._12_4_ * fVar196;
                auVar83 = vsubps_avx(auVar181,auVar203);
                fVar196 = auVar86._0_4_ * (float)local_9c0._0_4_;
                auVar225 = vmaxss_avx(ZEXT416((uint)fVar244),
                                      ZEXT416((uint)(fVar247 * fVar246 * 1.9073486e-06)));
                auVar18._8_4_ = 0x80000000;
                auVar18._0_8_ = 0x8000000080000000;
                auVar18._12_4_ = 0x80000000;
                auVar170._16_48_ = auVar243._16_48_;
                auVar91 = vxorps_avx512vl(auVar1,auVar18);
                auVar204._0_4_ = fVar248 * auVar83._0_4_ * fVar196;
                auVar204._4_4_ = fVar235 * auVar83._4_4_ * fVar196;
                auVar204._8_4_ = fVar236 * auVar83._8_4_ * fVar196;
                auVar204._12_4_ = fVar241 * auVar83._12_4_ * fVar196;
                auVar253 = ZEXT1664(auVar154);
                auVar83 = vdpps_avx(auVar91,auVar154,0x7f);
                auVar86 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar244),auVar225);
                auVar85 = vdpps_avx(local_ac0._0_16_,auVar204,0x7f);
                auVar87 = vfmadd213ss_fma(ZEXT416((uint)(fVar215 + 1.0)),
                                          ZEXT416((uint)(fVar244 / fVar240)),auVar86);
                auVar259 = ZEXT1664(auVar87);
                fVar248 = auVar83._0_4_ + auVar85._0_4_;
                auVar85 = vdpps_avx(local_a90,auVar154,0x7f);
                auVar83 = vdpps_avx(local_ac0._0_16_,auVar91,0x7f);
                auVar86 = vmulss_avx512f(auVar90,auVar88);
                auVar170._0_16_ =
                     vaddss_avx512f(auVar89,ZEXT416((uint)(auVar86._0_4_ *
                                                          auVar88._0_4_ * auVar88._0_4_)));
                auVar86 = vdpps_avx(local_ac0._0_16_,local_a90,0x7f);
                auVar88 = vfnmadd231ss_fma(auVar83,auVar84,ZEXT416((uint)fVar248));
                auVar89 = vfnmadd231ss_fma(auVar86,auVar84,auVar85);
                auVar83 = vpermilps_avx(local_990,0xff);
                fVar249 = fVar249 - auVar83._0_4_;
                auVar83 = vshufps_avx(auVar1,auVar1,0xff);
                auVar86 = vfmsub213ss_fma(auVar88,auVar170._0_16_,auVar83);
                fVar240 = auVar89._0_4_ * auVar170._0_4_;
                auVar88 = vfmsub231ss_fma(ZEXT416((uint)(auVar85._0_4_ * auVar86._0_4_)),
                                          ZEXT416((uint)fVar248),ZEXT416((uint)fVar240));
                fVar215 = auVar88._0_4_;
                fVar240 = fVar239 * (fVar240 / fVar215) - fVar249 * (auVar85._0_4_ / fVar215);
                auVar237 = ZEXT464((uint)fVar240);
                fVar250 = fVar250 - fVar240;
                auVar251 = ZEXT464((uint)fVar250);
                fVar247 = fVar247 - (fVar249 * (fVar248 / fVar215) -
                                    fVar239 * (auVar86._0_4_ / fVar215));
                auVar243 = ZEXT464((uint)fVar247);
                auVar227._8_4_ = 0x7fffffff;
                auVar227._0_8_ = 0x7fffffff7fffffff;
                auVar227._12_4_ = 0x7fffffff;
                auVar85 = vandps_avx(auVar84,auVar227);
                bVar79 = true;
                if (auVar85._0_4_ < auVar87._0_4_) {
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar87._0_4_ + auVar225._0_4_)),
                                            local_a00,ZEXT416(0x36000000));
                  auVar85 = vandps_avx(ZEXT416((uint)fVar249),auVar227);
                  if (auVar85._0_4_ < auVar86._0_4_) {
                    fVar247 = fVar247 + (float)local_9f0._0_4_;
                    auVar243 = ZEXT464((uint)fVar247);
                    if (fVar150 <= fVar247) {
                      fVar248 = *(float *)(ray + k * 4 + 0x200);
                      auVar237 = ZEXT464((uint)fVar248);
                      if (((fVar247 <= fVar248) && (0.0 <= fVar250)) && (fVar250 <= 1.0)) {
                        auVar139._16_48_ = auVar170._16_48_;
                        auVar139._0_16_ = ZEXT816(0) << 0x20;
                        auVar138._4_60_ = auVar139._4_60_;
                        auVar138._0_4_ = local_ae0._0_4_;
                        auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar138._0_16_);
                        fVar239 = auVar85._0_4_;
                        auVar170._0_16_ = vmulss_avx512f(local_ae0._0_16_,ZEXT416(0xbf000000));
                        pGVar3 = (context->scene->geometries).items[uVar75].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                            bVar74 = true;
                          }
                          else {
                            fVar239 = fVar239 * 1.5 + auVar170._0_4_ * fVar239 * fVar239 * fVar239;
                            auVar182._0_4_ = local_ac0._0_4_ * fVar239;
                            auVar182._4_4_ = local_ac0._4_4_ * fVar239;
                            auVar182._8_4_ = local_ac0._8_4_ * fVar239;
                            auVar182._12_4_ = local_ac0._12_4_ * fVar239;
                            auVar84 = vfmadd213ps_fma(auVar83,auVar182,auVar1);
                            auVar85 = vshufps_avx(auVar182,auVar182,0xc9);
                            auVar83 = vshufps_avx(auVar1,auVar1,0xc9);
                            auVar183._0_4_ = auVar182._0_4_ * auVar83._0_4_;
                            auVar183._4_4_ = auVar182._4_4_ * auVar83._4_4_;
                            auVar183._8_4_ = auVar182._8_4_ * auVar83._8_4_;
                            auVar183._12_4_ = auVar182._12_4_ * auVar83._12_4_;
                            auVar86 = vfmsub231ps_fma(auVar183,auVar1,auVar85);
                            auVar85 = vshufps_avx(auVar86,auVar86,0xc9);
                            auVar83 = vshufps_avx(auVar84,auVar84,0xc9);
                            auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                            auVar156._0_4_ = auVar84._0_4_ * auVar86._0_4_;
                            auVar156._4_4_ = auVar84._4_4_ * auVar86._4_4_;
                            auVar156._8_4_ = auVar84._8_4_ * auVar86._8_4_;
                            auVar156._12_4_ = auVar84._12_4_ * auVar86._12_4_;
                            auVar85 = vfmsub231ps_fma(auVar156,auVar85,auVar83);
                            auVar83 = ZEXT416((uint)fVar250);
                            local_340 = vbroadcastss_avx512f(auVar83);
                            auVar170 = vbroadcastss_avx512f(ZEXT416(1));
                            auVar170 = vpermps_avx512f(auVar170,ZEXT1664(auVar85));
                            auVar224 = vbroadcastss_avx512f(ZEXT416(2));
                            local_3c0 = vpermps_avx512f(auVar224,ZEXT1664(auVar85));
                            local_380 = vbroadcastss_avx512f(auVar85);
                            local_400[0] = (RTCHitN)auVar170[0];
                            local_400[1] = (RTCHitN)auVar170[1];
                            local_400[2] = (RTCHitN)auVar170[2];
                            local_400[3] = (RTCHitN)auVar170[3];
                            local_400[4] = (RTCHitN)auVar170[4];
                            local_400[5] = (RTCHitN)auVar170[5];
                            local_400[6] = (RTCHitN)auVar170[6];
                            local_400[7] = (RTCHitN)auVar170[7];
                            local_400[8] = (RTCHitN)auVar170[8];
                            local_400[9] = (RTCHitN)auVar170[9];
                            local_400[10] = (RTCHitN)auVar170[10];
                            local_400[0xb] = (RTCHitN)auVar170[0xb];
                            local_400[0xc] = (RTCHitN)auVar170[0xc];
                            local_400[0xd] = (RTCHitN)auVar170[0xd];
                            local_400[0xe] = (RTCHitN)auVar170[0xe];
                            local_400[0xf] = (RTCHitN)auVar170[0xf];
                            local_400[0x10] = (RTCHitN)auVar170[0x10];
                            local_400[0x11] = (RTCHitN)auVar170[0x11];
                            local_400[0x12] = (RTCHitN)auVar170[0x12];
                            local_400[0x13] = (RTCHitN)auVar170[0x13];
                            local_400[0x14] = (RTCHitN)auVar170[0x14];
                            local_400[0x15] = (RTCHitN)auVar170[0x15];
                            local_400[0x16] = (RTCHitN)auVar170[0x16];
                            local_400[0x17] = (RTCHitN)auVar170[0x17];
                            local_400[0x18] = (RTCHitN)auVar170[0x18];
                            local_400[0x19] = (RTCHitN)auVar170[0x19];
                            local_400[0x1a] = (RTCHitN)auVar170[0x1a];
                            local_400[0x1b] = (RTCHitN)auVar170[0x1b];
                            local_400[0x1c] = (RTCHitN)auVar170[0x1c];
                            local_400[0x1d] = (RTCHitN)auVar170[0x1d];
                            local_400[0x1e] = (RTCHitN)auVar170[0x1e];
                            local_400[0x1f] = (RTCHitN)auVar170[0x1f];
                            local_400[0x20] = (RTCHitN)auVar170[0x20];
                            local_400[0x21] = (RTCHitN)auVar170[0x21];
                            local_400[0x22] = (RTCHitN)auVar170[0x22];
                            local_400[0x23] = (RTCHitN)auVar170[0x23];
                            local_400[0x24] = (RTCHitN)auVar170[0x24];
                            local_400[0x25] = (RTCHitN)auVar170[0x25];
                            local_400[0x26] = (RTCHitN)auVar170[0x26];
                            local_400[0x27] = (RTCHitN)auVar170[0x27];
                            local_400[0x28] = (RTCHitN)auVar170[0x28];
                            local_400[0x29] = (RTCHitN)auVar170[0x29];
                            local_400[0x2a] = (RTCHitN)auVar170[0x2a];
                            local_400[0x2b] = (RTCHitN)auVar170[0x2b];
                            local_400[0x2c] = (RTCHitN)auVar170[0x2c];
                            local_400[0x2d] = (RTCHitN)auVar170[0x2d];
                            local_400[0x2e] = (RTCHitN)auVar170[0x2e];
                            local_400[0x2f] = (RTCHitN)auVar170[0x2f];
                            local_400[0x30] = (RTCHitN)auVar170[0x30];
                            local_400[0x31] = (RTCHitN)auVar170[0x31];
                            local_400[0x32] = (RTCHitN)auVar170[0x32];
                            local_400[0x33] = (RTCHitN)auVar170[0x33];
                            local_400[0x34] = (RTCHitN)auVar170[0x34];
                            local_400[0x35] = (RTCHitN)auVar170[0x35];
                            local_400[0x36] = (RTCHitN)auVar170[0x36];
                            local_400[0x37] = (RTCHitN)auVar170[0x37];
                            local_400[0x38] = (RTCHitN)auVar170[0x38];
                            local_400[0x39] = (RTCHitN)auVar170[0x39];
                            local_400[0x3a] = (RTCHitN)auVar170[0x3a];
                            local_400[0x3b] = (RTCHitN)auVar170[0x3b];
                            local_400[0x3c] = (RTCHitN)auVar170[0x3c];
                            local_400[0x3d] = (RTCHitN)auVar170[0x3d];
                            local_400[0x3e] = (RTCHitN)auVar170[0x3e];
                            local_400[0x3f] = (RTCHitN)auVar170[0x3f];
                            local_300 = 0;
                            uStack_2f8 = 0;
                            uStack_2f0 = 0;
                            uStack_2e8 = 0;
                            uStack_2e0 = 0;
                            uStack_2d8 = 0;
                            uStack_2d0 = 0;
                            uStack_2c8 = 0;
                            local_2c0 = local_440._0_8_;
                            uStack_2b8 = local_440._8_8_;
                            uStack_2b0 = local_440._16_8_;
                            uStack_2a8 = local_440._24_8_;
                            uStack_2a0 = local_440._32_8_;
                            uStack_298 = local_440._40_8_;
                            uStack_290 = local_440._48_8_;
                            uStack_288 = local_440._56_8_;
                            auVar170 = vmovdqa64_avx512f(local_480);
                            local_280 = vmovdqa64_avx512f(auVar170);
                            vpcmpeqd_avx2(auVar170._0_32_,auVar170._0_32_);
                            local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                            local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                            *(float *)(ray + k * 4 + 0x200) = fVar247;
                            local_940 = local_4c0;
                            local_b10.valid = (int *)local_940;
                            local_b10.geometryUserPtr = pGVar3->userPtr;
                            local_b10.context = context->user;
                            local_b10.hit = local_400;
                            local_b10.N = 0x10;
                            local_b10.ray = (RTCRayN *)ray;
                            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar245 = ZEXT1664(local_ac0._0_16_);
                              auVar253 = ZEXT1664(auVar154);
                              auVar257 = ZEXT1664(auVar1);
                              auVar259 = ZEXT1664(auVar87);
                              (*pGVar3->occlusionFilterN)(&local_b10);
                              auVar243 = ZEXT1664(ZEXT416((uint)fVar247));
                              auVar251 = ZEXT1664(auVar83);
                              auVar227._8_4_ = 0x7fffffff;
                              auVar227._0_8_ = 0x7fffffff7fffffff;
                              auVar227._12_4_ = 0x7fffffff;
                              auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar261 = ZEXT3264(auVar97);
                            }
                            auVar170 = vmovdqa64_avx512f(local_940);
                            uVar16 = vptestmd_avx512f(auVar170,auVar170);
                            if ((short)uVar16 == 0) {
                              bVar74 = false;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar245 = ZEXT1664(auVar245._0_16_);
                                auVar253 = ZEXT1664(auVar253._0_16_);
                                auVar257 = ZEXT1664(auVar257._0_16_);
                                auVar259 = ZEXT1664(auVar259._0_16_);
                                (*p_Var4)(&local_b10);
                                auVar243 = ZEXT1664(ZEXT416((uint)fVar247));
                                auVar251 = ZEXT1664(auVar83);
                                auVar227._8_4_ = 0x7fffffff;
                                auVar227._0_8_ = 0x7fffffff7fffffff;
                                auVar227._12_4_ = 0x7fffffff;
                                auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar261 = ZEXT3264(auVar97);
                              }
                              auVar170 = vmovdqa64_avx512f(local_940);
                              uVar81 = vptestmd_avx512f(auVar170,auVar170);
                              auVar224 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                              bVar79 = (bool)((byte)uVar81 & 1);
                              auVar170._0_4_ =
                                   (uint)bVar79 * auVar224._0_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x200);
                              bVar79 = (bool)((byte)(uVar81 >> 1) & 1);
                              auVar170._4_4_ =
                                   (uint)bVar79 * auVar224._4_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x204);
                              bVar79 = (bool)((byte)(uVar81 >> 2) & 1);
                              auVar170._8_4_ =
                                   (uint)bVar79 * auVar224._8_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x208);
                              bVar79 = (bool)((byte)(uVar81 >> 3) & 1);
                              auVar170._12_4_ =
                                   (uint)bVar79 * auVar224._12_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x20c);
                              bVar79 = (bool)((byte)(uVar81 >> 4) & 1);
                              auVar170._16_4_ =
                                   (uint)bVar79 * auVar224._16_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x210);
                              bVar79 = (bool)((byte)(uVar81 >> 5) & 1);
                              auVar170._20_4_ =
                                   (uint)bVar79 * auVar224._20_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x214);
                              bVar79 = (bool)((byte)(uVar81 >> 6) & 1);
                              auVar170._24_4_ =
                                   (uint)bVar79 * auVar224._24_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x218);
                              bVar79 = (bool)((byte)(uVar81 >> 7) & 1);
                              auVar170._28_4_ =
                                   (uint)bVar79 * auVar224._28_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x21c);
                              bVar79 = (bool)((byte)(uVar81 >> 8) & 1);
                              auVar170._32_4_ =
                                   (uint)bVar79 * auVar224._32_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x220);
                              bVar79 = (bool)((byte)(uVar81 >> 9) & 1);
                              auVar170._36_4_ =
                                   (uint)bVar79 * auVar224._36_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x224);
                              bVar79 = (bool)((byte)(uVar81 >> 10) & 1);
                              auVar170._40_4_ =
                                   (uint)bVar79 * auVar224._40_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x228);
                              bVar79 = (bool)((byte)(uVar81 >> 0xb) & 1);
                              auVar170._44_4_ =
                                   (uint)bVar79 * auVar224._44_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x22c);
                              bVar79 = (bool)((byte)(uVar81 >> 0xc) & 1);
                              auVar170._48_4_ =
                                   (uint)bVar79 * auVar224._48_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x230);
                              bVar79 = (bool)((byte)(uVar81 >> 0xd) & 1);
                              auVar170._52_4_ =
                                   (uint)bVar79 * auVar224._52_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x234);
                              bVar79 = (bool)((byte)(uVar81 >> 0xe) & 1);
                              auVar170._56_4_ =
                                   (uint)bVar79 * auVar224._56_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x238);
                              bVar79 = SUB81(uVar81 >> 0xf,0);
                              auVar170._60_4_ =
                                   (uint)bVar79 * auVar224._60_4_ |
                                   (uint)!bVar79 * *(int *)(local_b10.ray + 0x23c);
                              *(undefined1 (*) [64])(local_b10.ray + 0x200) = auVar170;
                              bVar74 = (short)uVar81 != 0;
                            }
                            if ((bool)bVar74 == false) {
                              *(float *)(ray + k * 4 + 0x200) = fVar248;
                            }
                          }
                          auVar237 = ZEXT464((uint)fVar248);
                          bVar79 = false;
                          goto LAB_01d4c184;
                        }
                      }
                    }
                    bVar79 = false;
                    bVar74 = 0;
                  }
                }
LAB_01d4c184:
                auVar97 = auVar170._32_32_;
                if (!bVar79) goto LAB_01d4c4c4;
                lVar78 = lVar78 + -1;
              } while (lVar78 != 0);
              bVar74 = 0;
LAB_01d4c4c4:
              bVar70 = bVar70 | bVar74 & 1;
              auVar63._4_4_ = fStack_8bc;
              auVar63._0_4_ = local_8c0;
              auVar63._8_4_ = fStack_8b8;
              auVar63._12_4_ = fStack_8b4;
              auVar63._16_4_ = fStack_8b0;
              auVar63._20_4_ = fStack_8ac;
              auVar63._24_4_ = fStack_8a8;
              auVar63._28_4_ = fStack_8a4;
              uVar151 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar25._4_4_ = uVar151;
              auVar25._0_4_ = uVar151;
              auVar25._8_4_ = uVar151;
              auVar25._12_4_ = uVar151;
              auVar25._16_4_ = uVar151;
              auVar25._20_4_ = uVar151;
              auVar25._24_4_ = uVar151;
              auVar25._28_4_ = uVar151;
              uVar16 = vcmpps_avx512vl(auVar63,auVar25,2);
              bVar72 = bVar67 & bVar72 & (byte)uVar16;
            } while (bVar72 != 0);
          }
          auVar166._0_4_ = (float)local_960._0_4_ + (float)local_8e0._0_4_;
          auVar166._4_4_ = (float)local_960._4_4_ + (float)local_8e0._4_4_;
          auVar166._8_4_ = fStack_958 + fStack_8d8;
          auVar166._12_4_ = fStack_954 + fStack_8d4;
          auVar166._16_4_ = fStack_950 + fStack_8d0;
          auVar166._20_4_ = fStack_94c + fStack_8cc;
          auVar166._24_4_ = fStack_948 + fStack_8c8;
          auVar166._28_4_ = fStack_944 + fStack_8c4;
          uVar151 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar26._4_4_ = uVar151;
          auVar26._0_4_ = uVar151;
          auVar26._8_4_ = uVar151;
          auVar26._12_4_ = uVar151;
          auVar26._16_4_ = uVar151;
          auVar26._20_4_ = uVar151;
          auVar26._24_4_ = uVar151;
          auVar26._28_4_ = uVar151;
          uVar16 = vcmpps_avx512vl(auVar166,auVar26,2);
          bVar73 = (byte)uVar14 | ~bVar73;
          bVar66 = (byte)uVar15 & bVar66 & (byte)uVar16;
          auVar167._8_4_ = 2;
          auVar167._0_8_ = 0x200000002;
          auVar167._12_4_ = 2;
          auVar167._16_4_ = 2;
          auVar167._20_4_ = 2;
          auVar167._24_4_ = 2;
          auVar167._28_4_ = 2;
          auVar27._8_4_ = 3;
          auVar27._0_8_ = 0x300000003;
          auVar27._12_4_ = 3;
          auVar27._16_4_ = 3;
          auVar27._20_4_ = 3;
          auVar27._24_4_ = 3;
          auVar27._28_4_ = 3;
          auVar96 = vpblendmd_avx512vl(auVar167,auVar27);
          local_8e0._0_4_ = (uint)(bVar73 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
          bVar79 = (bool)(bVar73 >> 1 & 1);
          local_8e0._4_4_ = (uint)bVar79 * auVar96._4_4_ | (uint)!bVar79 * 2;
          bVar79 = (bool)(bVar73 >> 2 & 1);
          fStack_8d8 = (float)((uint)bVar79 * auVar96._8_4_ | (uint)!bVar79 * 2);
          bVar79 = (bool)(bVar73 >> 3 & 1);
          fStack_8d4 = (float)((uint)bVar79 * auVar96._12_4_ | (uint)!bVar79 * 2);
          bVar79 = (bool)(bVar73 >> 4 & 1);
          fStack_8d0 = (float)((uint)bVar79 * auVar96._16_4_ | (uint)!bVar79 * 2);
          bVar79 = (bool)(bVar73 >> 5 & 1);
          fStack_8cc = (float)((uint)bVar79 * auVar96._20_4_ | (uint)!bVar79 * 2);
          bVar79 = (bool)(bVar73 >> 6 & 1);
          fStack_8c8 = (float)((uint)bVar79 * auVar96._24_4_ | (uint)!bVar79 * 2);
          fStack_8c4 = (float)((uint)(bVar73 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2
                              );
          auVar142._32_32_ = auVar97;
          auVar142._0_32_ = _local_8e0;
          uVar14 = vpcmpd_avx512vl(_local_8e0,local_860,2);
          bVar73 = (byte)uVar14 & bVar66;
          if (bVar73 != 0) {
            auVar83 = vminps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar85 = vmaxps_avx(local_a20._0_16_,local_a60._0_16_);
            auVar1 = vminps_avx(local_a40._0_16_,local_a80._0_16_);
            auVar86 = vminps_avx(auVar83,auVar1);
            auVar83 = vmaxps_avx(local_a40._0_16_,local_a80._0_16_);
            auVar1 = vmaxps_avx(auVar85,auVar83);
            auVar85 = vandps_avx(auVar86,auVar227);
            auVar83 = vandps_avx(auVar1,auVar227);
            auVar85 = vmaxps_avx(auVar85,auVar83);
            auVar83 = vmovshdup_avx(auVar85);
            auVar83 = vmaxss_avx(auVar83,auVar85);
            auVar85 = vshufpd_avx(auVar85,auVar85,1);
            auVar85 = vmaxss_avx(auVar85,auVar83);
            fVar244 = auVar85._0_4_ * 1.9073486e-06;
            local_a00 = vshufps_avx(auVar1,auVar1,0xff);
            _local_980 = _local_7c0;
            local_8c0 = (float)local_960._0_4_ + (float)local_7c0._0_4_;
            fStack_8bc = (float)local_960._4_4_ + (float)local_7c0._4_4_;
            fStack_8b8 = fStack_958 + fStack_7b8;
            fStack_8b4 = fStack_954 + fStack_7b4;
            fStack_8b0 = fStack_950 + fStack_7b0;
            fStack_8ac = fStack_94c + fStack_7ac;
            fStack_8a8 = fStack_948 + fStack_7a8;
            fStack_8a4 = fStack_944 + fStack_7a4;
            do {
              auVar168._8_4_ = 0x7f800000;
              auVar168._0_8_ = 0x7f8000007f800000;
              auVar168._12_4_ = 0x7f800000;
              auVar168._16_4_ = 0x7f800000;
              auVar168._20_4_ = 0x7f800000;
              auVar168._24_4_ = 0x7f800000;
              auVar168._28_4_ = 0x7f800000;
              auVar97 = vblendmps_avx512vl(auVar168,_local_980);
              auVar135._0_4_ =
                   (uint)(bVar73 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar73 & 1) * 0x7f800000;
              bVar79 = (bool)(bVar73 >> 1 & 1);
              auVar135._4_4_ = (uint)bVar79 * auVar97._4_4_ | (uint)!bVar79 * 0x7f800000;
              bVar79 = (bool)(bVar73 >> 2 & 1);
              auVar135._8_4_ = (uint)bVar79 * auVar97._8_4_ | (uint)!bVar79 * 0x7f800000;
              bVar79 = (bool)(bVar73 >> 3 & 1);
              auVar135._12_4_ = (uint)bVar79 * auVar97._12_4_ | (uint)!bVar79 * 0x7f800000;
              bVar79 = (bool)(bVar73 >> 4 & 1);
              auVar135._16_4_ = (uint)bVar79 * auVar97._16_4_ | (uint)!bVar79 * 0x7f800000;
              bVar79 = (bool)(bVar73 >> 5 & 1);
              auVar135._20_4_ = (uint)bVar79 * auVar97._20_4_ | (uint)!bVar79 * 0x7f800000;
              auVar135._24_4_ =
                   (uint)(bVar73 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar73 >> 6) * 0x7f800000;
              auVar135._28_4_ = 0x7f800000;
              auVar142._0_32_ = auVar135;
              auVar97 = vshufps_avx(auVar135,auVar135,0xb1);
              auVar97 = vminps_avx(auVar135,auVar97);
              auVar96 = vshufpd_avx(auVar97,auVar97,5);
              auVar97 = vminps_avx(auVar97,auVar96);
              auVar96 = vpermpd_avx2(auVar97,0x4e);
              auVar97 = vminps_avx(auVar97,auVar96);
              uVar14 = vcmpps_avx512vl(auVar135,auVar97,0);
              bVar74 = (byte)uVar14 & bVar73;
              bVar72 = bVar73;
              if (bVar74 != 0) {
                bVar72 = bVar74;
              }
              iVar17 = 0;
              for (uVar82 = (uint)bVar72; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              bVar72 = '\x01' << ((byte)iVar17 & 0x1f);
              uVar82 = *(uint *)(local_8a0 + (uint)(iVar17 << 2));
              uVar143 = *(uint *)(local_7a0 + (uint)(iVar17 << 2));
              fVar246 = auVar12._0_4_;
              if ((float)local_aa0._0_4_ < 0.0) {
                fVar246 = sqrtf((float)local_aa0._0_4_);
              }
              auVar251 = ZEXT464(uVar82);
              auVar243 = ZEXT464(uVar143);
              bVar74 = ~bVar72;
              lVar78 = 5;
              do {
                auVar97 = auVar142._32_32_;
                fVar247 = auVar243._0_4_;
                auVar157._4_4_ = fVar247;
                auVar157._0_4_ = fVar247;
                auVar157._8_4_ = fVar247;
                auVar157._12_4_ = fVar247;
                auVar85 = vfmadd132ps_fma(auVar157,ZEXT816(0) << 0x40,local_a90);
                fVar250 = auVar251._0_4_;
                fVar235 = 1.0 - fVar250;
                fVar239 = fVar235 * fVar235 * fVar235;
                fVar215 = fVar250 * fVar250 * fVar250;
                auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar239),
                                          ZEXT416((uint)fVar215));
                fVar248 = fVar250 * fVar235;
                auVar225 = ZEXT416((uint)fVar235);
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar248 * 6.0)),
                                          ZEXT416((uint)(fVar248 * fVar235)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar215),
                                         ZEXT416((uint)fVar239));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * fVar235 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar250 * fVar248)));
                fVar239 = fVar239 * 0.16666667;
                fVar240 = (auVar83._0_4_ + auVar86._0_4_) * 0.16666667;
                fVar249 = (auVar1._0_4_ + auVar84._0_4_) * 0.16666667;
                fVar215 = fVar215 * 0.16666667;
                auVar205._0_4_ = fVar215 * (float)local_a80._0_4_;
                auVar205._4_4_ = fVar215 * (float)local_a80._4_4_;
                auVar205._8_4_ = fVar215 * fStack_a78;
                auVar205._12_4_ = fVar215 * fStack_a74;
                auVar228._4_4_ = fVar249;
                auVar228._0_4_ = fVar249;
                auVar228._8_4_ = fVar249;
                auVar228._12_4_ = fVar249;
                auVar83 = vfmadd132ps_fma(auVar228,auVar205,local_a40._0_16_);
                auVar206._4_4_ = fVar240;
                auVar206._0_4_ = fVar240;
                auVar206._8_4_ = fVar240;
                auVar206._12_4_ = fVar240;
                auVar83 = vfmadd132ps_fma(auVar206,auVar83,local_a60._0_16_);
                auVar184._4_4_ = fVar239;
                auVar184._0_4_ = fVar239;
                auVar184._8_4_ = fVar239;
                auVar184._12_4_ = fVar239;
                local_990 = vfmadd132ps_fma(auVar184,auVar83,local_a20._0_16_);
                auVar85 = vsubps_avx(auVar85,local_990);
                local_ac0._0_16_ = auVar85;
                auVar85 = vdpps_avx(auVar85,auVar85,0x7f);
                auVar83 = auVar251._0_16_;
                local_ae0._0_16_ = auVar85;
                if (auVar85._0_4_ < 0.0) {
                  auVar245._0_4_ = sqrtf(auVar85._0_4_);
                  auVar245._4_60_ = extraout_var_00;
                  auVar85 = auVar245._0_16_;
                }
                else {
                  auVar85 = vsqrtss_avx(auVar85,auVar85);
                }
                auVar86 = vfnmsub213ss_fma(auVar83,auVar83,ZEXT416((uint)(fVar248 * 4.0)));
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * 4.0)),auVar225,auVar225);
                fVar248 = fVar235 * -fVar235 * 0.5;
                fVar239 = auVar86._0_4_ * 0.5;
                fVar240 = auVar1._0_4_ * 0.5;
                fVar249 = fVar250 * fVar250 * 0.5;
                auVar218._0_4_ = fVar249 * (float)local_a80._0_4_;
                auVar218._4_4_ = fVar249 * (float)local_a80._4_4_;
                auVar218._8_4_ = fVar249 * fStack_a78;
                auVar218._12_4_ = fVar249 * fStack_a74;
                auVar185._4_4_ = fVar240;
                auVar185._0_4_ = fVar240;
                auVar185._8_4_ = fVar240;
                auVar185._12_4_ = fVar240;
                auVar1 = vfmadd132ps_fma(auVar185,auVar218,local_a40._0_16_);
                auVar207._4_4_ = fVar239;
                auVar207._0_4_ = fVar239;
                auVar207._8_4_ = fVar239;
                auVar207._12_4_ = fVar239;
                auVar1 = vfmadd132ps_fma(auVar207,auVar1,local_a60._0_16_);
                auVar256._4_4_ = fVar248;
                auVar256._0_4_ = fVar248;
                auVar256._8_4_ = fVar248;
                auVar256._12_4_ = fVar248;
                auVar1 = vfmadd132ps_fma(auVar256,auVar1,local_a20._0_16_);
                local_9b0 = vdpps_avx(auVar1,auVar1,0x7f);
                auVar60._12_4_ = 0;
                auVar60._0_12_ = ZEXT812(0);
                fVar248 = local_9b0._0_4_;
                auVar86 = vrsqrt14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar248));
                fVar239 = auVar86._0_4_;
                local_9c0 = vrcp14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar248));
                auVar86 = vfnmadd213ss_fma(local_9c0,local_9b0,ZEXT416(0x40000000));
                uVar82 = auVar85._0_4_;
                local_9a0 = fVar235;
                fStack_99c = fVar235;
                fStack_998 = fVar235;
                fStack_994 = fVar235;
                if (fVar248 < -fVar248) {
                  fVar240 = sqrtf(fVar248);
                  auVar85 = ZEXT416(uVar82);
                }
                else {
                  auVar84 = vsqrtss_avx(local_9b0,local_9b0);
                  fVar240 = auVar84._0_4_;
                }
                fVar248 = fVar239 * 1.5 + fVar248 * -0.5 * fVar239 * fVar239 * fVar239;
                auVar158._0_4_ = auVar1._0_4_ * fVar248;
                auVar158._4_4_ = auVar1._4_4_ * fVar248;
                auVar158._8_4_ = auVar1._8_4_ * fVar248;
                auVar158._12_4_ = auVar1._12_4_ * fVar248;
                auVar84 = vdpps_avx(local_ac0._0_16_,auVar158,0x7f);
                fVar215 = auVar85._0_4_;
                fVar239 = auVar84._0_4_;
                auVar159._0_4_ = fVar239 * fVar239;
                auVar159._4_4_ = auVar84._4_4_ * auVar84._4_4_;
                auVar159._8_4_ = auVar84._8_4_ * auVar84._8_4_;
                auVar159._12_4_ = auVar84._12_4_ * auVar84._12_4_;
                auVar87 = vsubps_avx512vl(local_ae0._0_16_,auVar159);
                fVar249 = auVar87._0_4_;
                auVar186._4_12_ = ZEXT812(0) << 0x20;
                auVar186._0_4_ = fVar249;
                auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar186);
                auVar89 = vmulss_avx512f(auVar88,ZEXT416(0x3fc00000));
                auVar90 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
                if (fVar249 < 0.0) {
                  local_9e0 = fVar248;
                  fStack_9dc = fVar248;
                  fStack_9d8 = fVar248;
                  fStack_9d4 = fVar248;
                  local_9d0 = auVar88;
                  fVar249 = sqrtf(fVar249);
                  auVar90 = ZEXT416(auVar90._0_4_);
                  auVar89 = ZEXT416(auVar89._0_4_);
                  auVar85 = ZEXT416(uVar82);
                  auVar88 = local_9d0;
                  fVar248 = local_9e0;
                  fVar235 = fStack_9dc;
                  fVar236 = fStack_9d8;
                  fVar241 = fStack_9d4;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                  fVar249 = auVar87._0_4_;
                  fVar235 = fVar248;
                  fVar236 = fVar248;
                  fVar241 = fVar248;
                }
                auVar257 = ZEXT1664(auVar1);
                auVar245 = ZEXT1664(local_ac0._0_16_);
                auVar251._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar251._32_32_ = auVar97;
                auVar261 = ZEXT3264(auVar251._0_32_);
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar225,auVar83);
                auVar83 = vfmadd231ss_fma(auVar225,auVar83,SUB6416(ZEXT464(0xc0000000),0));
                auVar208._0_4_ = fVar250 * (float)local_a80._0_4_;
                auVar208._4_4_ = fVar250 * (float)local_a80._4_4_;
                auVar208._8_4_ = fVar250 * fStack_a78;
                auVar208._12_4_ = fVar250 * fStack_a74;
                auVar219._0_4_ = auVar83._0_4_;
                auVar219._4_4_ = auVar219._0_4_;
                auVar219._8_4_ = auVar219._0_4_;
                auVar219._12_4_ = auVar219._0_4_;
                auVar83 = vfmadd132ps_fma(auVar219,auVar208,local_a40._0_16_);
                auVar187._0_4_ = auVar87._0_4_;
                auVar187._4_4_ = auVar187._0_4_;
                auVar187._8_4_ = auVar187._0_4_;
                auVar187._12_4_ = auVar187._0_4_;
                auVar83 = vfmadd132ps_fma(auVar187,auVar83,local_a60._0_16_);
                auVar62._4_4_ = fStack_99c;
                auVar62._0_4_ = local_9a0;
                auVar62._8_4_ = fStack_998;
                auVar62._12_4_ = fStack_994;
                auVar83 = vfmadd132ps_fma(auVar62,auVar83,local_a20._0_16_);
                auVar188._0_4_ = auVar83._0_4_ * (float)local_9b0._0_4_;
                auVar188._4_4_ = auVar83._4_4_ * (float)local_9b0._0_4_;
                auVar188._8_4_ = auVar83._8_4_ * (float)local_9b0._0_4_;
                auVar188._12_4_ = auVar83._12_4_ * (float)local_9b0._0_4_;
                auVar83 = vdpps_avx(auVar1,auVar83,0x7f);
                fVar196 = auVar83._0_4_;
                auVar209._0_4_ = auVar1._0_4_ * fVar196;
                auVar209._4_4_ = auVar1._4_4_ * fVar196;
                auVar209._8_4_ = auVar1._8_4_ * fVar196;
                auVar209._12_4_ = auVar1._12_4_ * fVar196;
                auVar83 = vsubps_avx(auVar188,auVar209);
                fVar196 = auVar86._0_4_ * (float)local_9c0._0_4_;
                auVar225 = vmaxss_avx(ZEXT416((uint)fVar244),
                                      ZEXT416((uint)(fVar247 * fVar246 * 1.9073486e-06)));
                auVar19._8_4_ = 0x80000000;
                auVar19._0_8_ = 0x8000000080000000;
                auVar19._12_4_ = 0x80000000;
                auVar142._16_48_ = auVar251._16_48_;
                auVar91 = vxorps_avx512vl(auVar1,auVar19);
                auVar210._0_4_ = fVar248 * auVar83._0_4_ * fVar196;
                auVar210._4_4_ = fVar235 * auVar83._4_4_ * fVar196;
                auVar210._8_4_ = fVar236 * auVar83._8_4_ * fVar196;
                auVar210._12_4_ = fVar241 * auVar83._12_4_ * fVar196;
                auVar253 = ZEXT1664(auVar158);
                auVar83 = vdpps_avx(auVar91,auVar158,0x7f);
                auVar86 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar244),auVar225);
                auVar85 = vdpps_avx(local_ac0._0_16_,auVar210,0x7f);
                auVar87 = vfmadd213ss_fma(ZEXT416((uint)(fVar215 + 1.0)),
                                          ZEXT416((uint)(fVar244 / fVar240)),auVar86);
                auVar259 = ZEXT1664(auVar87);
                fVar248 = auVar83._0_4_ + auVar85._0_4_;
                auVar85 = vdpps_avx(local_a90,auVar158,0x7f);
                auVar83 = vdpps_avx(local_ac0._0_16_,auVar91,0x7f);
                auVar86 = vmulss_avx512f(auVar90,auVar88);
                auVar142._0_16_ =
                     vaddss_avx512f(auVar89,ZEXT416((uint)(auVar86._0_4_ *
                                                          auVar88._0_4_ * auVar88._0_4_)));
                auVar86 = vdpps_avx(local_ac0._0_16_,local_a90,0x7f);
                auVar88 = vfnmadd231ss_fma(auVar83,auVar84,ZEXT416((uint)fVar248));
                auVar89 = vfnmadd231ss_fma(auVar86,auVar84,auVar85);
                auVar83 = vpermilps_avx(local_990,0xff);
                fVar249 = fVar249 - auVar83._0_4_;
                auVar83 = vshufps_avx(auVar1,auVar1,0xff);
                auVar86 = vfmsub213ss_fma(auVar88,auVar142._0_16_,auVar83);
                fVar240 = auVar89._0_4_ * auVar142._0_4_;
                auVar88 = vfmsub231ss_fma(ZEXT416((uint)(auVar85._0_4_ * auVar86._0_4_)),
                                          ZEXT416((uint)fVar248),ZEXT416((uint)fVar240));
                fVar215 = auVar88._0_4_;
                fVar240 = fVar239 * (fVar240 / fVar215) - fVar249 * (auVar85._0_4_ / fVar215);
                auVar237 = ZEXT464((uint)fVar240);
                fVar250 = fVar250 - fVar240;
                auVar251 = ZEXT464((uint)fVar250);
                fVar247 = fVar247 - (fVar249 * (fVar248 / fVar215) -
                                    fVar239 * (auVar86._0_4_ / fVar215));
                auVar243 = ZEXT464((uint)fVar247);
                auVar229._8_4_ = 0x7fffffff;
                auVar229._0_8_ = 0x7fffffff7fffffff;
                auVar229._12_4_ = 0x7fffffff;
                auVar85 = vandps_avx(auVar84,auVar229);
                bVar79 = true;
                if (auVar85._0_4_ < auVar87._0_4_) {
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar87._0_4_ + auVar225._0_4_)),
                                            local_a00,ZEXT416(0x36000000));
                  auVar85 = vandps_avx(ZEXT416((uint)fVar249),auVar229);
                  if (auVar85._0_4_ < auVar86._0_4_) {
                    fVar247 = fVar247 + (float)local_9f0._0_4_;
                    auVar243 = ZEXT464((uint)fVar247);
                    if ((((fVar150 <= fVar247) &&
                         (fVar248 = *(float *)(ray + k * 4 + 0x200), fVar247 <= fVar248)) &&
                        (0.0 <= fVar250)) && (fVar250 <= 1.0)) {
                      auVar141._16_48_ = auVar142._16_48_;
                      auVar141._0_16_ = ZEXT816(0) << 0x20;
                      auVar140._4_60_ = auVar141._4_60_;
                      auVar140._0_4_ = local_ae0._0_4_;
                      auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar140._0_16_);
                      fVar239 = auVar85._0_4_;
                      auVar142._0_16_ = vmulss_avx512f(local_ae0._0_16_,ZEXT416(0xbf000000));
                      pGVar3 = (context->scene->geometries).items[uVar75].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          bVar72 = true;
                        }
                        else {
                          fVar239 = fVar239 * 1.5 + auVar142._0_4_ * fVar239 * fVar239 * fVar239;
                          auVar189._0_4_ = local_ac0._0_4_ * fVar239;
                          auVar189._4_4_ = local_ac0._4_4_ * fVar239;
                          auVar189._8_4_ = local_ac0._8_4_ * fVar239;
                          auVar189._12_4_ = local_ac0._12_4_ * fVar239;
                          auVar84 = vfmadd213ps_fma(auVar83,auVar189,auVar1);
                          auVar85 = vshufps_avx(auVar189,auVar189,0xc9);
                          auVar83 = vshufps_avx(auVar1,auVar1,0xc9);
                          auVar190._0_4_ = auVar189._0_4_ * auVar83._0_4_;
                          auVar190._4_4_ = auVar189._4_4_ * auVar83._4_4_;
                          auVar190._8_4_ = auVar189._8_4_ * auVar83._8_4_;
                          auVar190._12_4_ = auVar189._12_4_ * auVar83._12_4_;
                          auVar86 = vfmsub231ps_fma(auVar190,auVar1,auVar85);
                          auVar85 = vshufps_avx(auVar86,auVar86,0xc9);
                          auVar83 = vshufps_avx(auVar84,auVar84,0xc9);
                          auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                          auVar160._0_4_ = auVar84._0_4_ * auVar86._0_4_;
                          auVar160._4_4_ = auVar84._4_4_ * auVar86._4_4_;
                          auVar160._8_4_ = auVar84._8_4_ * auVar86._8_4_;
                          auVar160._12_4_ = auVar84._12_4_ * auVar86._12_4_;
                          auVar85 = vfmsub231ps_fma(auVar160,auVar85,auVar83);
                          auVar83 = ZEXT416((uint)fVar250);
                          local_340 = vbroadcastss_avx512f(auVar83);
                          auVar170 = vbroadcastss_avx512f(ZEXT416(1));
                          auVar170 = vpermps_avx512f(auVar170,ZEXT1664(auVar85));
                          auVar224 = vbroadcastss_avx512f(ZEXT416(2));
                          local_3c0 = vpermps_avx512f(auVar224,ZEXT1664(auVar85));
                          local_380 = vbroadcastss_avx512f(auVar85);
                          local_400[0] = (RTCHitN)auVar170[0];
                          local_400[1] = (RTCHitN)auVar170[1];
                          local_400[2] = (RTCHitN)auVar170[2];
                          local_400[3] = (RTCHitN)auVar170[3];
                          local_400[4] = (RTCHitN)auVar170[4];
                          local_400[5] = (RTCHitN)auVar170[5];
                          local_400[6] = (RTCHitN)auVar170[6];
                          local_400[7] = (RTCHitN)auVar170[7];
                          local_400[8] = (RTCHitN)auVar170[8];
                          local_400[9] = (RTCHitN)auVar170[9];
                          local_400[10] = (RTCHitN)auVar170[10];
                          local_400[0xb] = (RTCHitN)auVar170[0xb];
                          local_400[0xc] = (RTCHitN)auVar170[0xc];
                          local_400[0xd] = (RTCHitN)auVar170[0xd];
                          local_400[0xe] = (RTCHitN)auVar170[0xe];
                          local_400[0xf] = (RTCHitN)auVar170[0xf];
                          local_400[0x10] = (RTCHitN)auVar170[0x10];
                          local_400[0x11] = (RTCHitN)auVar170[0x11];
                          local_400[0x12] = (RTCHitN)auVar170[0x12];
                          local_400[0x13] = (RTCHitN)auVar170[0x13];
                          local_400[0x14] = (RTCHitN)auVar170[0x14];
                          local_400[0x15] = (RTCHitN)auVar170[0x15];
                          local_400[0x16] = (RTCHitN)auVar170[0x16];
                          local_400[0x17] = (RTCHitN)auVar170[0x17];
                          local_400[0x18] = (RTCHitN)auVar170[0x18];
                          local_400[0x19] = (RTCHitN)auVar170[0x19];
                          local_400[0x1a] = (RTCHitN)auVar170[0x1a];
                          local_400[0x1b] = (RTCHitN)auVar170[0x1b];
                          local_400[0x1c] = (RTCHitN)auVar170[0x1c];
                          local_400[0x1d] = (RTCHitN)auVar170[0x1d];
                          local_400[0x1e] = (RTCHitN)auVar170[0x1e];
                          local_400[0x1f] = (RTCHitN)auVar170[0x1f];
                          local_400[0x20] = (RTCHitN)auVar170[0x20];
                          local_400[0x21] = (RTCHitN)auVar170[0x21];
                          local_400[0x22] = (RTCHitN)auVar170[0x22];
                          local_400[0x23] = (RTCHitN)auVar170[0x23];
                          local_400[0x24] = (RTCHitN)auVar170[0x24];
                          local_400[0x25] = (RTCHitN)auVar170[0x25];
                          local_400[0x26] = (RTCHitN)auVar170[0x26];
                          local_400[0x27] = (RTCHitN)auVar170[0x27];
                          local_400[0x28] = (RTCHitN)auVar170[0x28];
                          local_400[0x29] = (RTCHitN)auVar170[0x29];
                          local_400[0x2a] = (RTCHitN)auVar170[0x2a];
                          local_400[0x2b] = (RTCHitN)auVar170[0x2b];
                          local_400[0x2c] = (RTCHitN)auVar170[0x2c];
                          local_400[0x2d] = (RTCHitN)auVar170[0x2d];
                          local_400[0x2e] = (RTCHitN)auVar170[0x2e];
                          local_400[0x2f] = (RTCHitN)auVar170[0x2f];
                          local_400[0x30] = (RTCHitN)auVar170[0x30];
                          local_400[0x31] = (RTCHitN)auVar170[0x31];
                          local_400[0x32] = (RTCHitN)auVar170[0x32];
                          local_400[0x33] = (RTCHitN)auVar170[0x33];
                          local_400[0x34] = (RTCHitN)auVar170[0x34];
                          local_400[0x35] = (RTCHitN)auVar170[0x35];
                          local_400[0x36] = (RTCHitN)auVar170[0x36];
                          local_400[0x37] = (RTCHitN)auVar170[0x37];
                          local_400[0x38] = (RTCHitN)auVar170[0x38];
                          local_400[0x39] = (RTCHitN)auVar170[0x39];
                          local_400[0x3a] = (RTCHitN)auVar170[0x3a];
                          local_400[0x3b] = (RTCHitN)auVar170[0x3b];
                          local_400[0x3c] = (RTCHitN)auVar170[0x3c];
                          local_400[0x3d] = (RTCHitN)auVar170[0x3d];
                          local_400[0x3e] = (RTCHitN)auVar170[0x3e];
                          local_400[0x3f] = (RTCHitN)auVar170[0x3f];
                          local_300 = 0;
                          uStack_2f8 = 0;
                          uStack_2f0 = 0;
                          uStack_2e8 = 0;
                          uStack_2e0 = 0;
                          uStack_2d8 = 0;
                          uStack_2d0 = 0;
                          uStack_2c8 = 0;
                          local_2c0 = local_440._0_8_;
                          uStack_2b8 = local_440._8_8_;
                          uStack_2b0 = local_440._16_8_;
                          uStack_2a8 = local_440._24_8_;
                          uStack_2a0 = local_440._32_8_;
                          uStack_298 = local_440._40_8_;
                          uStack_290 = local_440._48_8_;
                          uStack_288 = local_440._56_8_;
                          auVar170 = vmovdqa64_avx512f(local_480);
                          local_280 = vmovdqa64_avx512f(auVar170);
                          vpcmpeqd_avx2(auVar170._0_32_,auVar170._0_32_);
                          local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                          local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                          *(float *)(ray + k * 4 + 0x200) = fVar247;
                          local_940 = local_4c0;
                          local_b10.valid = (int *)local_940;
                          local_b10.geometryUserPtr = pGVar3->userPtr;
                          local_b10.context = context->user;
                          local_b10.hit = local_400;
                          local_b10.N = 0x10;
                          local_b10.ray = (RTCRayN *)ray;
                          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar237 = ZEXT464((uint)fVar240);
                            auVar245 = ZEXT1664(local_ac0._0_16_);
                            auVar253 = ZEXT1664(auVar158);
                            auVar257 = ZEXT1664(auVar1);
                            auVar259 = ZEXT1664(auVar87);
                            (*pGVar3->occlusionFilterN)(&local_b10);
                            auVar243 = ZEXT1664(ZEXT416((uint)fVar247));
                            auVar251 = ZEXT1664(auVar83);
                            auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar261 = ZEXT3264(auVar97);
                          }
                          auVar142 = vmovdqa64_avx512f(local_940);
                          uVar14 = vptestmd_avx512f(auVar142,auVar142);
                          if ((short)uVar14 == 0) {
                            bVar72 = false;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar237 = ZEXT1664(auVar237._0_16_);
                              auVar245 = ZEXT1664(auVar245._0_16_);
                              auVar253 = ZEXT1664(auVar253._0_16_);
                              auVar257 = ZEXT1664(auVar257._0_16_);
                              auVar259 = ZEXT1664(auVar259._0_16_);
                              (*p_Var4)(&local_b10);
                              auVar243 = ZEXT1664(ZEXT416((uint)fVar247));
                              auVar251 = ZEXT1664(auVar83);
                              auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar261 = ZEXT3264(auVar97);
                            }
                            auVar170 = vmovdqa64_avx512f(local_940);
                            uVar81 = vptestmd_avx512f(auVar170,auVar170);
                            auVar170 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                            bVar79 = (bool)((byte)uVar81 & 1);
                            auVar142._0_4_ =
                                 (uint)bVar79 * auVar170._0_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x200);
                            bVar79 = (bool)((byte)(uVar81 >> 1) & 1);
                            auVar142._4_4_ =
                                 (uint)bVar79 * auVar170._4_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x204);
                            bVar79 = (bool)((byte)(uVar81 >> 2) & 1);
                            auVar142._8_4_ =
                                 (uint)bVar79 * auVar170._8_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x208);
                            bVar79 = (bool)((byte)(uVar81 >> 3) & 1);
                            auVar142._12_4_ =
                                 (uint)bVar79 * auVar170._12_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x20c);
                            bVar79 = (bool)((byte)(uVar81 >> 4) & 1);
                            auVar142._16_4_ =
                                 (uint)bVar79 * auVar170._16_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x210);
                            bVar79 = (bool)((byte)(uVar81 >> 5) & 1);
                            auVar142._20_4_ =
                                 (uint)bVar79 * auVar170._20_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x214);
                            bVar79 = (bool)((byte)(uVar81 >> 6) & 1);
                            auVar142._24_4_ =
                                 (uint)bVar79 * auVar170._24_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x218);
                            bVar79 = (bool)((byte)(uVar81 >> 7) & 1);
                            auVar142._28_4_ =
                                 (uint)bVar79 * auVar170._28_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x21c);
                            bVar79 = (bool)((byte)(uVar81 >> 8) & 1);
                            auVar142._32_4_ =
                                 (uint)bVar79 * auVar170._32_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x220);
                            bVar79 = (bool)((byte)(uVar81 >> 9) & 1);
                            auVar142._36_4_ =
                                 (uint)bVar79 * auVar170._36_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x224);
                            bVar79 = (bool)((byte)(uVar81 >> 10) & 1);
                            auVar142._40_4_ =
                                 (uint)bVar79 * auVar170._40_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x228);
                            bVar79 = (bool)((byte)(uVar81 >> 0xb) & 1);
                            auVar142._44_4_ =
                                 (uint)bVar79 * auVar170._44_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x22c);
                            bVar79 = (bool)((byte)(uVar81 >> 0xc) & 1);
                            auVar142._48_4_ =
                                 (uint)bVar79 * auVar170._48_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x230);
                            bVar79 = (bool)((byte)(uVar81 >> 0xd) & 1);
                            auVar142._52_4_ =
                                 (uint)bVar79 * auVar170._52_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x234);
                            bVar79 = (bool)((byte)(uVar81 >> 0xe) & 1);
                            auVar142._56_4_ =
                                 (uint)bVar79 * auVar170._56_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x238);
                            bVar79 = SUB81(uVar81 >> 0xf,0);
                            auVar142._60_4_ =
                                 (uint)bVar79 * auVar170._60_4_ |
                                 (uint)!bVar79 * *(int *)(local_b10.ray + 0x23c);
                            *(undefined1 (*) [64])(local_b10.ray + 0x200) = auVar142;
                            bVar72 = (short)uVar81 != 0;
                          }
                          if ((bool)bVar72 == false) {
                            *(float *)(ray + k * 4 + 0x200) = fVar248;
                          }
                        }
                        bVar79 = false;
                        goto LAB_01d4ccad;
                      }
                    }
                    bVar79 = false;
                    bVar72 = 0;
                  }
                }
LAB_01d4ccad:
                if (!bVar79) goto LAB_01d4cfdb;
                lVar78 = lVar78 + -1;
              } while (lVar78 != 0);
              bVar72 = 0;
LAB_01d4cfdb:
              bVar70 = bVar70 | bVar72 & 1;
              auVar64._4_4_ = fStack_8bc;
              auVar64._0_4_ = local_8c0;
              auVar64._8_4_ = fStack_8b8;
              auVar64._12_4_ = fStack_8b4;
              auVar64._16_4_ = fStack_8b0;
              auVar64._20_4_ = fStack_8ac;
              auVar64._24_4_ = fStack_8a8;
              auVar64._28_4_ = fStack_8a4;
              uVar151 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar28._4_4_ = uVar151;
              auVar28._0_4_ = uVar151;
              auVar28._8_4_ = uVar151;
              auVar28._12_4_ = uVar151;
              auVar28._16_4_ = uVar151;
              auVar28._20_4_ = uVar151;
              auVar28._24_4_ = uVar151;
              auVar28._28_4_ = uVar151;
              uVar14 = vcmpps_avx512vl(auVar64,auVar28,2);
              bVar73 = bVar74 & bVar73 & (byte)uVar14;
            } while (bVar73 != 0);
          }
          uVar16 = vpcmpd_avx512vl(local_860,_local_8e0,1);
          uVar15 = vpcmpd_avx512vl(local_860,local_780,1);
          auVar191._0_4_ = (float)local_960._0_4_ + (float)local_500._0_4_;
          auVar191._4_4_ = (float)local_960._4_4_ + (float)local_500._4_4_;
          auVar191._8_4_ = fStack_958 + fStack_4f8;
          auVar191._12_4_ = fStack_954 + fStack_4f4;
          auVar191._16_4_ = fStack_950 + fStack_4f0;
          auVar191._20_4_ = fStack_94c + fStack_4ec;
          auVar191._24_4_ = fStack_948 + fStack_4e8;
          auVar191._28_4_ = fStack_944 + fStack_4e4;
          uVar151 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar211._4_4_ = uVar151;
          auVar211._0_4_ = uVar151;
          auVar211._8_4_ = uVar151;
          auVar211._12_4_ = uVar151;
          auVar211._16_4_ = uVar151;
          auVar211._20_4_ = uVar151;
          auVar211._24_4_ = uVar151;
          auVar211._28_4_ = uVar151;
          uVar14 = vcmpps_avx512vl(auVar191,auVar211,2);
          bVar68 = bVar68 & (byte)uVar15 & (byte)uVar14;
          auVar223._0_4_ = (float)local_960._0_4_ + local_7c0._0_4_;
          auVar223._4_4_ = (float)local_960._4_4_ + local_7c0._4_4_;
          auVar223._8_4_ = fStack_958 + local_7c0._8_4_;
          auVar223._12_4_ = fStack_954 + local_7c0._12_4_;
          auVar223._16_4_ = fStack_950 + local_7c0._16_4_;
          auVar223._20_4_ = fStack_94c + local_7c0._20_4_;
          auVar223._24_4_ = fStack_948 + local_7c0._24_4_;
          auVar223._28_4_ = fStack_944 + local_7c0._28_4_;
          uVar14 = vcmpps_avx512vl(auVar223,auVar211,2);
          bVar66 = bVar66 & (byte)uVar16 & (byte)uVar14 | bVar68;
          if (bVar66 == 0) {
            auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,&DAT_3f8000003f800000)))))));
            auVar170 = ZEXT1664(auVar197);
          }
          else {
            local_1a0[uVar69 * 0x60] = bVar66;
            auVar136._0_4_ =
                 (uint)(bVar68 & 1) * local_500._0_4_ |
                 (uint)!(bool)(bVar68 & 1) * (int)local_7c0._0_4_;
            bVar79 = (bool)(bVar68 >> 1 & 1);
            auVar136._4_4_ = (uint)bVar79 * local_500._4_4_ | (uint)!bVar79 * (int)local_7c0._4_4_;
            bVar79 = (bool)(bVar68 >> 2 & 1);
            auVar136._8_4_ = (uint)bVar79 * (int)fStack_4f8 | (uint)!bVar79 * (int)local_7c0._8_4_;
            bVar79 = (bool)(bVar68 >> 3 & 1);
            auVar136._12_4_ = (uint)bVar79 * (int)fStack_4f4 | (uint)!bVar79 * (int)local_7c0._12_4_
            ;
            bVar79 = (bool)(bVar68 >> 4 & 1);
            auVar136._16_4_ = (uint)bVar79 * (int)fStack_4f0 | (uint)!bVar79 * (int)local_7c0._16_4_
            ;
            bVar79 = (bool)(bVar68 >> 5 & 1);
            auVar136._20_4_ = (uint)bVar79 * (int)fStack_4ec | (uint)!bVar79 * (int)local_7c0._20_4_
            ;
            auVar136._24_4_ =
                 (uint)(bVar68 >> 6) * (int)fStack_4e8 |
                 (uint)!(bool)(bVar68 >> 6) * (int)local_7c0._24_4_;
            auVar136._28_4_ = local_7c0._28_4_;
            auVar142._0_32_ = auVar136;
            *(undefined1 (*) [32])(auStack_180 + uVar69 * 0x60) = auVar136;
            auVar170 = ZEXT1664(auVar197);
            uVar14 = vmovlps_avx(auVar197);
            *(undefined8 *)(local_160 + uVar69 * 0x18) = uVar14;
            local_158[uVar69 * 0x18] = iVar77 + 1;
            auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,&DAT_3f8000003f800000)))))));
            uVar69 = (ulong)((int)uVar69 + 1);
          }
        }
      }
    }
    do {
      if ((int)uVar69 == 0) {
        if (bVar70 != 0) {
          return bVar80;
        }
        uVar151 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar30._4_4_ = uVar151;
        auVar30._0_4_ = uVar151;
        auVar30._8_4_ = uVar151;
        auVar30._12_4_ = uVar151;
        auVar30._16_4_ = uVar151;
        auVar30._20_4_ = uVar151;
        auVar30._24_4_ = uVar151;
        auVar30._28_4_ = uVar151;
        uVar14 = vcmpps_avx512vl(local_760,auVar30,2);
        uVar75 = (uint)uVar76 & (uint)uVar14;
        uVar76 = (ulong)uVar75;
        bVar80 = uVar75 != 0;
        if (!bVar80) {
          return bVar80;
        }
        goto LAB_01d4ac52;
      }
      uVar71 = (ulong)((int)uVar69 - 1);
      lVar78 = uVar71 * 0x60;
      auVar97 = *(undefined1 (*) [32])(auStack_180 + lVar78);
      auVar192._0_4_ = auVar97._0_4_ + (float)local_960._0_4_;
      auVar192._4_4_ = auVar97._4_4_ + (float)local_960._4_4_;
      auVar192._8_4_ = auVar97._8_4_ + fStack_958;
      auVar192._12_4_ = auVar97._12_4_ + fStack_954;
      auVar192._16_4_ = auVar97._16_4_ + fStack_950;
      auVar192._20_4_ = auVar97._20_4_ + fStack_94c;
      auVar192._24_4_ = auVar97._24_4_ + fStack_948;
      auVar192._28_4_ = auVar97._28_4_ + fStack_944;
      uVar151 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar29._4_4_ = uVar151;
      auVar29._0_4_ = uVar151;
      auVar29._8_4_ = uVar151;
      auVar29._12_4_ = uVar151;
      auVar29._16_4_ = uVar151;
      auVar29._20_4_ = uVar151;
      auVar29._24_4_ = uVar151;
      auVar29._28_4_ = uVar151;
      uVar14 = vcmpps_avx512vl(auVar192,auVar29,2);
      uVar82 = (uint)uVar14 & (uint)local_1a0[lVar78];
      bVar66 = (byte)uVar82;
      uVar81 = uVar71;
      if (uVar82 != 0) {
        auVar193._8_4_ = 0x7f800000;
        auVar193._0_8_ = 0x7f8000007f800000;
        auVar193._12_4_ = 0x7f800000;
        auVar193._16_4_ = 0x7f800000;
        auVar193._20_4_ = 0x7f800000;
        auVar193._24_4_ = 0x7f800000;
        auVar193._28_4_ = 0x7f800000;
        auVar96 = vblendmps_avx512vl(auVar193,auVar97);
        auVar137._0_4_ =
             (uint)(bVar66 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar66 & 1) * (int)auVar97._0_4_;
        bVar79 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar137._4_4_ = (uint)bVar79 * auVar96._4_4_ | (uint)!bVar79 * (int)auVar97._4_4_;
        bVar79 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar137._8_4_ = (uint)bVar79 * auVar96._8_4_ | (uint)!bVar79 * (int)auVar97._8_4_;
        bVar79 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar137._12_4_ = (uint)bVar79 * auVar96._12_4_ | (uint)!bVar79 * (int)auVar97._12_4_;
        bVar79 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar137._16_4_ = (uint)bVar79 * auVar96._16_4_ | (uint)!bVar79 * (int)auVar97._16_4_;
        bVar79 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar137._20_4_ = (uint)bVar79 * auVar96._20_4_ | (uint)!bVar79 * (int)auVar97._20_4_;
        bVar79 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar137._24_4_ = (uint)bVar79 * auVar96._24_4_ | (uint)!bVar79 * (int)auVar97._24_4_;
        auVar137._28_4_ =
             (uVar82 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar82 >> 7,0) * (int)auVar97._28_4_;
        auVar142._0_32_ = auVar137;
        auVar97 = vshufps_avx(auVar137,auVar137,0xb1);
        auVar97 = vminps_avx(auVar137,auVar97);
        auVar96 = vshufpd_avx(auVar97,auVar97,5);
        auVar97 = vminps_avx(auVar97,auVar96);
        auVar96 = vpermpd_avx2(auVar97,0x4e);
        auVar97 = vminps_avx(auVar97,auVar96);
        uVar14 = vcmpps_avx512vl(auVar137,auVar97,0);
        bVar73 = (byte)uVar14 & bVar66;
        if (bVar73 != 0) {
          uVar82 = (uint)bVar73;
        }
        fVar244 = local_160[uVar71 * 0x18 + 1];
        uVar143 = 0;
        for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
          uVar143 = uVar143 + 1;
        }
        iVar77 = local_158[uVar71 * 0x18];
        bVar73 = ~('\x01' << ((byte)uVar143 & 0x1f)) & bVar66;
        local_1a0[lVar78] = bVar73;
        if (bVar73 != 0) {
          uVar81 = uVar69;
        }
        fVar246 = local_160[uVar71 * 0x18];
        auVar194._4_4_ = fVar246;
        auVar194._0_4_ = fVar246;
        auVar194._8_4_ = fVar246;
        auVar194._12_4_ = fVar246;
        auVar194._16_4_ = fVar246;
        auVar194._20_4_ = fVar246;
        auVar194._24_4_ = fVar246;
        auVar194._28_4_ = fVar246;
        fVar244 = fVar244 - fVar246;
        auVar169._4_4_ = fVar244;
        auVar169._0_4_ = fVar244;
        auVar169._8_4_ = fVar244;
        auVar169._12_4_ = fVar244;
        auVar169._16_4_ = fVar244;
        auVar169._20_4_ = fVar244;
        auVar169._24_4_ = fVar244;
        auVar169._28_4_ = fVar244;
        auVar85 = vfmadd132ps_fma(auVar169,auVar194,_DAT_02020f20);
        auVar97 = ZEXT1632(auVar85);
        local_400[0] = (RTCHitN)auVar97[0];
        local_400[1] = (RTCHitN)auVar97[1];
        local_400[2] = (RTCHitN)auVar97[2];
        local_400[3] = (RTCHitN)auVar97[3];
        local_400[4] = (RTCHitN)auVar97[4];
        local_400[5] = (RTCHitN)auVar97[5];
        local_400[6] = (RTCHitN)auVar97[6];
        local_400[7] = (RTCHitN)auVar97[7];
        local_400[8] = (RTCHitN)auVar97[8];
        local_400[9] = (RTCHitN)auVar97[9];
        local_400[10] = (RTCHitN)auVar97[10];
        local_400[0xb] = (RTCHitN)auVar97[0xb];
        local_400[0xc] = (RTCHitN)auVar97[0xc];
        local_400[0xd] = (RTCHitN)auVar97[0xd];
        local_400[0xe] = (RTCHitN)auVar97[0xe];
        local_400[0xf] = (RTCHitN)auVar97[0xf];
        local_400[0x10] = (RTCHitN)auVar97[0x10];
        local_400[0x11] = (RTCHitN)auVar97[0x11];
        local_400[0x12] = (RTCHitN)auVar97[0x12];
        local_400[0x13] = (RTCHitN)auVar97[0x13];
        local_400[0x14] = (RTCHitN)auVar97[0x14];
        local_400[0x15] = (RTCHitN)auVar97[0x15];
        local_400[0x16] = (RTCHitN)auVar97[0x16];
        local_400[0x17] = (RTCHitN)auVar97[0x17];
        local_400[0x18] = (RTCHitN)auVar97[0x18];
        local_400[0x19] = (RTCHitN)auVar97[0x19];
        local_400[0x1a] = (RTCHitN)auVar97[0x1a];
        local_400[0x1b] = (RTCHitN)auVar97[0x1b];
        local_400[0x1c] = (RTCHitN)auVar97[0x1c];
        local_400[0x1d] = (RTCHitN)auVar97[0x1d];
        local_400[0x1e] = (RTCHitN)auVar97[0x1e];
        local_400[0x1f] = (RTCHitN)auVar97[0x1f];
        auVar170 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar143 * 4));
      }
      uVar69 = uVar81;
    } while (bVar66 == 0);
    auVar97 = auVar142._32_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }